

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,16>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  uint uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  uint uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  byte bVar29;
  uint uVar30;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar51 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar52 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar102 [48];
  undefined1 auVar86 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar90 [64];
  undefined1 auVar92 [64];
  undefined1 auVar94 [64];
  undefined1 auVar96 [64];
  undefined1 auVar98 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  float fVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar108 [64];
  float t1;
  undefined4 uVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar123;
  float fVar124;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  vfloat4 b0;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  vfloat4 b0_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  vfloat4 a0_3;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  vfloat4 a0_2;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar198;
  float fVar199;
  float fVar209;
  float fVar211;
  float fVar213;
  undefined1 auVar200 [16];
  float fVar210;
  float fVar212;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar214;
  float fVar223;
  float fVar224;
  vfloat4 a0_1;
  undefined1 auVar215 [16];
  float fVar225;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  vfloat4 a0;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  uint auStack_600 [4];
  RTCFilterFunctionNArguments local_5f0;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [16];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar31;
  undefined1 auVar89 [64];
  undefined1 auVar91 [64];
  undefined1 auVar93 [64];
  undefined1 auVar95 [64];
  undefined1 auVar97 [64];
  undefined1 auVar99 [64];
  
  PVar7 = prim[1];
  uVar33 = (ulong)(byte)PVar7;
  fVar124 = *(float *)(prim + uVar33 * 0x19 + 0x12);
  auVar40 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar40 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar50 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar42 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar52 = vsubps_avx(auVar40,*(undefined1 (*) [16])(prim + uVar33 * 0x19 + 6));
  fVar123 = fVar124 * auVar52._0_4_;
  fVar103 = fVar124 * auVar42._0_4_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar33 * 4 + 6);
  auVar69 = vpmovsxbd_avx2(auVar40);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar33 * 5 + 6);
  auVar67 = vpmovsxbd_avx2(auVar50);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar33 * 6 + 6);
  auVar80 = vpmovsxbd_avx2(auVar4);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar33 * 0xb + 6);
  auVar81 = vpmovsxbd_avx2(auVar49);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  auVar73 = vpmovsxbd_avx2(auVar48);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar82 = vcvtdq2ps_avx(auVar73);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + (uint)(byte)PVar7 * 0xc + uVar33 + 6);
  auVar68 = vpmovsxbd_avx2(auVar47);
  auVar68 = vcvtdq2ps_avx(auVar68);
  uVar32 = (ulong)(uint)((int)(uVar33 * 9) * 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar32 + 6);
  auVar70 = vpmovsxbd_avx2(auVar5);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar32 + uVar33 + 6);
  auVar71 = vpmovsxbd_avx2(auVar46);
  auVar71 = vcvtdq2ps_avx(auVar71);
  uVar25 = (ulong)(uint)((int)(uVar33 * 5) << 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar25 + 6);
  auVar66 = vpmovsxbd_avx2(auVar6);
  auVar72 = vcvtdq2ps_avx(auVar66);
  auVar134._4_4_ = fVar103;
  auVar134._0_4_ = fVar103;
  auVar134._8_4_ = fVar103;
  auVar134._12_4_ = fVar103;
  auVar134._16_4_ = fVar103;
  auVar134._20_4_ = fVar103;
  auVar134._24_4_ = fVar103;
  auVar134._28_4_ = fVar103;
  auVar238._8_4_ = 1;
  auVar238._0_8_ = 0x100000001;
  auVar238._12_4_ = 1;
  auVar238._16_4_ = 1;
  auVar238._20_4_ = 1;
  auVar238._24_4_ = 1;
  auVar238._28_4_ = 1;
  auVar64 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar75 = ZEXT1632(CONCAT412(fVar124 * auVar42._12_4_,
                               CONCAT48(fVar124 * auVar42._8_4_,
                                        CONCAT44(fVar124 * auVar42._4_4_,fVar103))));
  auVar74 = vpermps_avx2(auVar238,auVar75);
  auVar65 = vpermps_avx512vl(auVar64,auVar75);
  fVar103 = auVar65._0_4_;
  fVar199 = auVar65._4_4_;
  auVar75._4_4_ = fVar199 * auVar80._4_4_;
  auVar75._0_4_ = fVar103 * auVar80._0_4_;
  fVar210 = auVar65._8_4_;
  auVar75._8_4_ = fVar210 * auVar80._8_4_;
  fVar212 = auVar65._12_4_;
  auVar75._12_4_ = fVar212 * auVar80._12_4_;
  fVar109 = auVar65._16_4_;
  auVar75._16_4_ = fVar109 * auVar80._16_4_;
  fVar110 = auVar65._20_4_;
  auVar75._20_4_ = fVar110 * auVar80._20_4_;
  fVar111 = auVar65._24_4_;
  auVar75._24_4_ = fVar111 * auVar80._24_4_;
  auVar75._28_4_ = auVar73._28_4_;
  auVar73._4_4_ = auVar68._4_4_ * fVar199;
  auVar73._0_4_ = auVar68._0_4_ * fVar103;
  auVar73._8_4_ = auVar68._8_4_ * fVar210;
  auVar73._12_4_ = auVar68._12_4_ * fVar212;
  auVar73._16_4_ = auVar68._16_4_ * fVar109;
  auVar73._20_4_ = auVar68._20_4_ * fVar110;
  auVar73._24_4_ = auVar68._24_4_ * fVar111;
  auVar73._28_4_ = auVar66._28_4_;
  auVar66._4_4_ = auVar72._4_4_ * fVar199;
  auVar66._0_4_ = auVar72._0_4_ * fVar103;
  auVar66._8_4_ = auVar72._8_4_ * fVar210;
  auVar66._12_4_ = auVar72._12_4_ * fVar212;
  auVar66._16_4_ = auVar72._16_4_ * fVar109;
  auVar66._20_4_ = auVar72._20_4_ * fVar110;
  auVar66._24_4_ = auVar72._24_4_ * fVar111;
  auVar66._28_4_ = auVar65._28_4_;
  auVar40 = vfmadd231ps_fma(auVar75,auVar74,auVar67);
  auVar50 = vfmadd231ps_fma(auVar73,auVar74,auVar82);
  auVar4 = vfmadd231ps_fma(auVar66,auVar71,auVar74);
  auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar134,auVar69);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar134,auVar81);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar70,auVar134);
  auVar146._4_4_ = fVar123;
  auVar146._0_4_ = fVar123;
  auVar146._8_4_ = fVar123;
  auVar146._12_4_ = fVar123;
  auVar146._16_4_ = fVar123;
  auVar146._20_4_ = fVar123;
  auVar146._24_4_ = fVar123;
  auVar146._28_4_ = fVar123;
  auVar66 = ZEXT1632(CONCAT412(fVar124 * auVar52._12_4_,
                               CONCAT48(fVar124 * auVar52._8_4_,
                                        CONCAT44(fVar124 * auVar52._4_4_,fVar123))));
  auVar73 = vpermps_avx2(auVar238,auVar66);
  auVar66 = vpermps_avx512vl(auVar64,auVar66);
  fVar124 = auVar66._0_4_;
  fVar103 = auVar66._4_4_;
  auVar74._4_4_ = fVar103 * auVar80._4_4_;
  auVar74._0_4_ = fVar124 * auVar80._0_4_;
  fVar199 = auVar66._8_4_;
  auVar74._8_4_ = fVar199 * auVar80._8_4_;
  fVar210 = auVar66._12_4_;
  auVar74._12_4_ = fVar210 * auVar80._12_4_;
  fVar212 = auVar66._16_4_;
  auVar74._16_4_ = fVar212 * auVar80._16_4_;
  fVar109 = auVar66._20_4_;
  auVar74._20_4_ = fVar109 * auVar80._20_4_;
  fVar110 = auVar66._24_4_;
  auVar74._24_4_ = fVar110 * auVar80._24_4_;
  auVar74._28_4_ = 1;
  auVar64._4_4_ = auVar68._4_4_ * fVar103;
  auVar64._0_4_ = auVar68._0_4_ * fVar124;
  auVar64._8_4_ = auVar68._8_4_ * fVar199;
  auVar64._12_4_ = auVar68._12_4_ * fVar210;
  auVar64._16_4_ = auVar68._16_4_ * fVar212;
  auVar64._20_4_ = auVar68._20_4_ * fVar109;
  auVar64._24_4_ = auVar68._24_4_ * fVar110;
  auVar64._28_4_ = auVar80._28_4_;
  auVar68._4_4_ = auVar72._4_4_ * fVar103;
  auVar68._0_4_ = auVar72._0_4_ * fVar124;
  auVar68._8_4_ = auVar72._8_4_ * fVar199;
  auVar68._12_4_ = auVar72._12_4_ * fVar210;
  auVar68._16_4_ = auVar72._16_4_ * fVar212;
  auVar68._20_4_ = auVar72._20_4_ * fVar109;
  auVar68._24_4_ = auVar72._24_4_ * fVar110;
  auVar68._28_4_ = auVar66._28_4_;
  auVar49 = vfmadd231ps_fma(auVar74,auVar73,auVar67);
  auVar48 = vfmadd231ps_fma(auVar64,auVar73,auVar82);
  auVar47 = vfmadd231ps_fma(auVar68,auVar73,auVar71);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar146,auVar69);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar146,auVar81);
  auVar83._8_4_ = 0x7fffffff;
  auVar83._0_8_ = 0x7fffffff7fffffff;
  auVar83._12_4_ = 0x7fffffff;
  auVar83._16_4_ = 0x7fffffff;
  auVar83._20_4_ = 0x7fffffff;
  auVar83._24_4_ = 0x7fffffff;
  auVar83._28_4_ = 0x7fffffff;
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar146,auVar70);
  auVar69 = vandps_avx(ZEXT1632(auVar40),auVar83);
  auVar85._8_4_ = 0x219392ef;
  auVar85._0_8_ = 0x219392ef219392ef;
  auVar85._12_4_ = 0x219392ef;
  auVar85._16_4_ = 0x219392ef;
  auVar85._20_4_ = 0x219392ef;
  auVar85._24_4_ = 0x219392ef;
  auVar85._28_4_ = 0x219392ef;
  uVar32 = vcmpps_avx512vl(auVar69,auVar85,1);
  bVar35 = (bool)((byte)uVar32 & 1);
  auVar65._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar40._0_4_;
  bVar35 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar65._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar40._4_4_;
  bVar35 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar65._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar40._8_4_;
  bVar35 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar65._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar40._12_4_;
  auVar65._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * 0x219392ef;
  auVar65._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * 0x219392ef;
  auVar65._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * 0x219392ef;
  auVar65._28_4_ = (uint)(byte)(uVar32 >> 7) * 0x219392ef;
  auVar69 = vandps_avx(ZEXT1632(auVar50),auVar83);
  uVar32 = vcmpps_avx512vl(auVar69,auVar85,1);
  bVar35 = (bool)((byte)uVar32 & 1);
  auVar76._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar50._0_4_;
  bVar35 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar50._4_4_;
  bVar35 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar50._8_4_;
  bVar35 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar50._12_4_;
  auVar76._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * 0x219392ef;
  auVar76._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * 0x219392ef;
  auVar76._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * 0x219392ef;
  auVar76._28_4_ = (uint)(byte)(uVar32 >> 7) * 0x219392ef;
  auVar69 = vandps_avx(ZEXT1632(auVar4),auVar83);
  uVar32 = vcmpps_avx512vl(auVar69,auVar85,1);
  bVar35 = (bool)((byte)uVar32 & 1);
  auVar69._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar4._0_4_;
  bVar35 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar69._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar4._4_4_;
  bVar35 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar69._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar4._8_4_;
  bVar35 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar69._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar4._12_4_;
  auVar69._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * 0x219392ef;
  auVar69._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * 0x219392ef;
  auVar69._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * 0x219392ef;
  auVar69._28_4_ = (uint)(byte)(uVar32 >> 7) * 0x219392ef;
  auVar67 = vrcp14ps_avx512vl(auVar65);
  auVar84._8_4_ = 0x3f800000;
  auVar84._0_8_ = 0x3f8000003f800000;
  auVar84._12_4_ = 0x3f800000;
  auVar84._16_4_ = 0x3f800000;
  auVar84._20_4_ = 0x3f800000;
  auVar84._24_4_ = 0x3f800000;
  auVar84._28_4_ = 0x3f800000;
  auVar40 = vfnmadd213ps_fma(auVar65,auVar67,auVar84);
  auVar40 = vfmadd132ps_fma(ZEXT1632(auVar40),auVar67,auVar67);
  auVar67 = vrcp14ps_avx512vl(auVar76);
  auVar50 = vfnmadd213ps_fma(auVar76,auVar67,auVar84);
  auVar50 = vfmadd132ps_fma(ZEXT1632(auVar50),auVar67,auVar67);
  auVar67 = vrcp14ps_avx512vl(auVar69);
  auVar4 = vfnmadd213ps_fma(auVar69,auVar67,auVar84);
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar67,auVar67);
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar33 * 7 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,ZEXT1632(auVar49));
  auVar70._4_4_ = auVar40._4_4_ * auVar69._4_4_;
  auVar70._0_4_ = auVar40._0_4_ * auVar69._0_4_;
  auVar70._8_4_ = auVar40._8_4_ * auVar69._8_4_;
  auVar70._12_4_ = auVar40._12_4_ * auVar69._12_4_;
  auVar70._16_4_ = auVar69._16_4_ * 0.0;
  auVar70._20_4_ = auVar69._20_4_ * 0.0;
  auVar70._24_4_ = auVar69._24_4_ * 0.0;
  auVar70._28_4_ = auVar69._28_4_;
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar33 * 9 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,ZEXT1632(auVar49));
  auVar68 = vpbroadcastd_avx512vl();
  auVar67 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar79._0_4_ = auVar40._0_4_ * auVar69._0_4_;
  auVar79._4_4_ = auVar40._4_4_ * auVar69._4_4_;
  auVar79._8_4_ = auVar40._8_4_ * auVar69._8_4_;
  auVar79._12_4_ = auVar40._12_4_ * auVar69._12_4_;
  auVar79._16_4_ = auVar69._16_4_ * 0.0;
  auVar79._20_4_ = auVar69._20_4_ * 0.0;
  auVar79._24_4_ = auVar69._24_4_ * 0.0;
  auVar79._28_4_ = 0;
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar7 * 0x10 + uVar33 * -2 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,ZEXT1632(auVar48));
  auVar71._4_4_ = auVar50._4_4_ * auVar69._4_4_;
  auVar71._0_4_ = auVar50._0_4_ * auVar69._0_4_;
  auVar71._8_4_ = auVar50._8_4_ * auVar69._8_4_;
  auVar71._12_4_ = auVar50._12_4_ * auVar69._12_4_;
  auVar71._16_4_ = auVar69._16_4_ * 0.0;
  auVar71._20_4_ = auVar69._20_4_ * 0.0;
  auVar71._24_4_ = auVar69._24_4_ * 0.0;
  auVar71._28_4_ = auVar69._28_4_;
  auVar69 = vcvtdq2ps_avx(auVar67);
  auVar69 = vsubps_avx(auVar69,ZEXT1632(auVar48));
  auVar78._0_4_ = auVar50._0_4_ * auVar69._0_4_;
  auVar78._4_4_ = auVar50._4_4_ * auVar69._4_4_;
  auVar78._8_4_ = auVar50._8_4_ * auVar69._8_4_;
  auVar78._12_4_ = auVar50._12_4_ * auVar69._12_4_;
  auVar78._16_4_ = auVar69._16_4_ * 0.0;
  auVar78._20_4_ = auVar69._20_4_ * 0.0;
  auVar78._24_4_ = auVar69._24_4_ * 0.0;
  auVar78._28_4_ = 0;
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar25 + uVar33 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,ZEXT1632(auVar47));
  auVar72._4_4_ = auVar69._4_4_ * auVar4._4_4_;
  auVar72._0_4_ = auVar69._0_4_ * auVar4._0_4_;
  auVar72._8_4_ = auVar69._8_4_ * auVar4._8_4_;
  auVar72._12_4_ = auVar69._12_4_ * auVar4._12_4_;
  auVar72._16_4_ = auVar69._16_4_ * 0.0;
  auVar72._20_4_ = auVar69._20_4_ * 0.0;
  auVar72._24_4_ = auVar69._24_4_ * 0.0;
  auVar72._28_4_ = auVar69._28_4_;
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar33 * 0x17 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,ZEXT1632(auVar47));
  auVar77._0_4_ = auVar4._0_4_ * auVar69._0_4_;
  auVar77._4_4_ = auVar4._4_4_ * auVar69._4_4_;
  auVar77._8_4_ = auVar4._8_4_ * auVar69._8_4_;
  auVar77._12_4_ = auVar4._12_4_ * auVar69._12_4_;
  auVar77._16_4_ = auVar69._16_4_ * 0.0;
  auVar77._20_4_ = auVar69._20_4_ * 0.0;
  auVar77._24_4_ = auVar69._24_4_ * 0.0;
  auVar77._28_4_ = 0;
  auVar69 = vpminsd_avx2(auVar70,auVar79);
  auVar67 = vpminsd_avx2(auVar71,auVar78);
  auVar69 = vmaxps_avx(auVar69,auVar67);
  auVar67 = vpminsd_avx2(auVar72,auVar77);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar80._4_4_ = uVar112;
  auVar80._0_4_ = uVar112;
  auVar80._8_4_ = uVar112;
  auVar80._12_4_ = uVar112;
  auVar80._16_4_ = uVar112;
  auVar80._20_4_ = uVar112;
  auVar80._24_4_ = uVar112;
  auVar80._28_4_ = uVar112;
  auVar67 = vmaxps_avx512vl(auVar67,auVar80);
  auVar69 = vmaxps_avx(auVar69,auVar67);
  auVar67._8_4_ = 0x3f7ffffa;
  auVar67._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar67._12_4_ = 0x3f7ffffa;
  auVar67._16_4_ = 0x3f7ffffa;
  auVar67._20_4_ = 0x3f7ffffa;
  auVar67._24_4_ = 0x3f7ffffa;
  auVar67._28_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar69,auVar67);
  auVar69 = vpmaxsd_avx2(auVar70,auVar79);
  auVar67 = vpmaxsd_avx2(auVar71,auVar78);
  auVar69 = vminps_avx(auVar69,auVar67);
  auVar67 = vpmaxsd_avx2(auVar72,auVar77);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar81._4_4_ = uVar112;
  auVar81._0_4_ = uVar112;
  auVar81._8_4_ = uVar112;
  auVar81._12_4_ = uVar112;
  auVar81._16_4_ = uVar112;
  auVar81._20_4_ = uVar112;
  auVar81._24_4_ = uVar112;
  auVar81._28_4_ = uVar112;
  auVar67 = vminps_avx512vl(auVar67,auVar81);
  auVar69 = vminps_avx(auVar69,auVar67);
  auVar82._8_4_ = 0x3f800003;
  auVar82._0_8_ = 0x3f8000033f800003;
  auVar82._12_4_ = 0x3f800003;
  auVar82._16_4_ = 0x3f800003;
  auVar82._20_4_ = 0x3f800003;
  auVar82._24_4_ = 0x3f800003;
  auVar82._28_4_ = 0x3f800003;
  auVar69 = vmulps_avx512vl(auVar69,auVar82);
  uVar14 = vpcmpgtd_avx512vl(auVar68,_DAT_01fe9900);
  uVar13 = vcmpps_avx512vl(local_3c0,auVar69,2);
  if ((byte)((byte)uVar13 & (byte)uVar14) == 0) {
    return false;
  }
  uVar32 = (ulong)(byte)((byte)uVar13 & (byte)uVar14);
  auVar108 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar108);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar108 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar239 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar240 = ZEXT1664(auVar40);
  auVar247 = ZEXT464(0x3f800000);
  auVar40 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar246 = ZEXT1664(auVar40);
LAB_01cd2641:
  lVar28 = 0;
  for (uVar25 = uVar32; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
    lVar28 = lVar28 + 1;
  }
  uVar34 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar34].ptr;
  uVar25 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar28 * 4 + 6));
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar40 = *(undefined1 (*) [16])(_Var12 + uVar25 * (long)pvVar11);
  auVar50 = *(undefined1 (*) [16])(_Var12 + (uVar25 + 1) * (long)pvVar11);
  auVar4 = *(undefined1 (*) [16])(_Var12 + (uVar25 + 2) * (long)pvVar11);
  auVar49 = *(undefined1 (*) [16])(_Var12 + (long)pvVar11 * (uVar25 + 3));
  lVar28 = *(long *)&pGVar9[1].time_range.upper;
  auVar48 = *(undefined1 (*) [16])(lVar28 + (long)p_Var10 * uVar25);
  auVar47 = *(undefined1 (*) [16])(lVar28 + (long)p_Var10 * (uVar25 + 1));
  auVar5 = *(undefined1 (*) [16])(lVar28 + (long)p_Var10 * (uVar25 + 2));
  uVar32 = uVar32 - 1 & uVar32;
  auVar46 = *(undefined1 (*) [16])(lVar28 + (long)p_Var10 * (uVar25 + 3));
  if (uVar32 != 0) {
    uVar33 = uVar32 - 1 & uVar32;
    for (uVar25 = uVar32; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
    }
    if (uVar33 != 0) {
      for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c
                        );
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar115 = ZEXT816(0) << 0x40;
  auVar44._0_4_ = auVar46._0_4_ * 0.0;
  auVar44._4_4_ = auVar46._4_4_ * 0.0;
  auVar44._8_4_ = auVar46._8_4_ * 0.0;
  auVar44._12_4_ = auVar46._12_4_ * 0.0;
  auVar229._8_4_ = 0x3e2aaaab;
  auVar229._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar229._12_4_ = 0x3e2aaaab;
  auVar42 = vfmadd213ps_fma(auVar229,auVar5,auVar44);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar47,auVar41);
  auVar52 = vfmadd231ps_fma(auVar42,auVar48,auVar229);
  auVar51 = auVar108._0_16_;
  auVar42 = vfmadd231ps_avx512vl(auVar44,auVar5,auVar51);
  auVar42 = vfnmadd231ps_fma(auVar42,auVar47,auVar115);
  auVar43 = vfnmadd231ps_avx512vl(auVar42,auVar48,auVar51);
  auVar215._0_4_ = auVar49._0_4_ * 0.0;
  auVar215._4_4_ = auVar49._4_4_ * 0.0;
  auVar215._8_4_ = auVar49._8_4_ * 0.0;
  auVar215._12_4_ = auVar49._12_4_ * 0.0;
  auVar42 = vfmadd213ps_fma(auVar229,auVar4,auVar215);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar50,auVar41);
  auVar42 = vfmadd231ps_fma(auVar42,auVar40,auVar229);
  auVar44 = vfmadd231ps_avx512vl(auVar215,auVar4,auVar51);
  auVar44 = vfnmadd231ps_fma(auVar44,auVar50,auVar115);
  auVar45 = vfnmadd231ps_avx512vl(auVar44,auVar40,auVar51);
  auVar63._0_4_ = auVar46._0_4_ * 0.16666667;
  auVar63._4_4_ = auVar46._4_4_ * 0.16666667;
  auVar63._8_4_ = auVar46._8_4_ * 0.16666667;
  auVar63._12_4_ = auVar46._12_4_ * 0.16666667;
  auVar44 = vfmadd231ps_avx512vl(auVar63,auVar5,auVar41);
  auVar44 = vfmadd231ps_fma(auVar44,auVar47,auVar229);
  auVar44 = vfmadd231ps_fma(auVar44,auVar48,auVar115);
  auVar46 = vmulps_avx512vl(auVar46,auVar51);
  auVar5 = vfmadd231ps_fma(auVar46,auVar115,auVar5);
  auVar47 = vfnmadd231ps_avx512vl(auVar5,auVar51,auVar47);
  auVar5 = vfnmadd231ps_fma(auVar47,auVar115,auVar48);
  auVar178._0_4_ = auVar49._0_4_ * 0.16666667;
  auVar178._4_4_ = auVar49._4_4_ * 0.16666667;
  auVar178._8_4_ = auVar49._8_4_ * 0.16666667;
  auVar178._12_4_ = auVar49._12_4_ * 0.16666667;
  auVar48 = vfmadd231ps_avx512vl(auVar178,auVar4,auVar41);
  auVar48 = vfmadd231ps_fma(auVar48,auVar50,auVar229);
  auVar48 = vfmadd231ps_fma(auVar48,auVar40,auVar115);
  auVar49 = vmulps_avx512vl(auVar49,auVar51);
  auVar4 = vfmadd231ps_fma(auVar49,auVar115,auVar4);
  auVar50 = vfnmadd231ps_avx512vl(auVar4,auVar51,auVar50);
  auVar47 = vfnmadd231ps_fma(auVar50,auVar115,auVar40);
  auVar40 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar50 = vshufps_avx(auVar42,auVar42,0xc9);
  fVar212 = auVar43._0_4_;
  auVar53._0_4_ = fVar212 * auVar50._0_4_;
  fVar109 = auVar43._4_4_;
  auVar53._4_4_ = fVar109 * auVar50._4_4_;
  fVar110 = auVar43._8_4_;
  auVar53._8_4_ = fVar110 * auVar50._8_4_;
  fVar111 = auVar43._12_4_;
  auVar53._12_4_ = fVar111 * auVar50._12_4_;
  auVar50 = vfmsub231ps_fma(auVar53,auVar40,auVar42);
  auVar4 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar54._0_4_ = fVar212 * auVar50._0_4_;
  auVar54._4_4_ = fVar109 * auVar50._4_4_;
  auVar54._8_4_ = fVar110 * auVar50._8_4_;
  auVar54._12_4_ = fVar111 * auVar50._12_4_;
  auVar40 = vfmsub231ps_fma(auVar54,auVar40,auVar45);
  auVar49 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vshufps_avx(auVar5,auVar5,0xc9);
  auVar50 = vshufps_avx(auVar48,auVar48,0xc9);
  fVar123 = auVar5._0_4_;
  auVar58._0_4_ = fVar123 * auVar50._0_4_;
  fVar136 = auVar5._4_4_;
  auVar58._4_4_ = fVar136 * auVar50._4_4_;
  fVar137 = auVar5._8_4_;
  auVar58._8_4_ = fVar137 * auVar50._8_4_;
  fVar138 = auVar5._12_4_;
  auVar58._12_4_ = fVar138 * auVar50._12_4_;
  auVar50 = vfmsub231ps_fma(auVar58,auVar40,auVar48);
  auVar48 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar179._0_4_ = auVar50._0_4_ * fVar123;
  auVar179._4_4_ = auVar50._4_4_ * fVar136;
  auVar179._8_4_ = auVar50._8_4_ * fVar137;
  auVar179._12_4_ = auVar50._12_4_ * fVar138;
  auVar40 = vfmsub231ps_fma(auVar179,auVar40,auVar47);
  auVar47 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vdpps_avx(auVar4,auVar4,0x7f);
  fVar103 = auVar40._0_4_;
  auVar180._4_12_ = ZEXT812(0) << 0x20;
  auVar180._0_4_ = fVar103;
  auVar50 = vrsqrt14ss_avx512f(auVar115,auVar180);
  auVar46 = vmulss_avx512f(auVar50,ZEXT416(0x3fc00000));
  auVar42 = vmulss_avx512f(auVar40,ZEXT416(0xbf000000));
  fVar124 = auVar50._0_4_;
  fVar124 = auVar46._0_4_ + auVar42._0_4_ * fVar124 * fVar124 * fVar124;
  fVar214 = fVar124 * auVar4._0_4_;
  fVar223 = fVar124 * auVar4._4_4_;
  fVar224 = fVar124 * auVar4._8_4_;
  fVar225 = fVar124 * auVar4._12_4_;
  auVar50 = vdpps_avx(auVar4,auVar49,0x7f);
  auVar191._0_4_ = auVar49._0_4_ * fVar103;
  auVar191._4_4_ = auVar49._4_4_ * fVar103;
  auVar191._8_4_ = auVar49._8_4_ * fVar103;
  auVar191._12_4_ = auVar49._12_4_ * fVar103;
  fVar103 = auVar50._0_4_;
  auVar157._0_4_ = fVar103 * auVar4._0_4_;
  auVar157._4_4_ = fVar103 * auVar4._4_4_;
  auVar157._8_4_ = fVar103 * auVar4._8_4_;
  auVar157._12_4_ = fVar103 * auVar4._12_4_;
  auVar4 = vsubps_avx(auVar191,auVar157);
  auVar50 = vrcp14ss_avx512f(auVar115,auVar180);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar50,ZEXT416(0x40000000));
  fVar199 = auVar50._0_4_ * auVar40._0_4_;
  auVar40 = vdpps_avx(auVar48,auVar48,0x7f);
  fVar210 = auVar40._0_4_;
  auVar171._4_12_ = ZEXT812(0) << 0x20;
  auVar171._0_4_ = fVar210;
  auVar50 = vrsqrt14ss_avx512f(auVar115,auVar171);
  auVar49 = vmulss_avx512f(auVar50,ZEXT416(0x3fc00000));
  auVar46 = vmulss_avx512f(auVar40,ZEXT416(0xbf000000));
  fVar103 = auVar50._0_4_;
  fVar103 = auVar49._0_4_ + auVar46._0_4_ * fVar103 * fVar103 * fVar103;
  fVar198 = fVar103 * auVar48._0_4_;
  fVar209 = fVar103 * auVar48._4_4_;
  fVar211 = fVar103 * auVar48._8_4_;
  fVar213 = fVar103 * auVar48._12_4_;
  auVar50 = vdpps_avx(auVar48,auVar47,0x7f);
  auVar61._0_4_ = fVar210 * auVar47._0_4_;
  auVar61._4_4_ = fVar210 * auVar47._4_4_;
  auVar61._8_4_ = fVar210 * auVar47._8_4_;
  auVar61._12_4_ = fVar210 * auVar47._12_4_;
  fVar210 = auVar50._0_4_;
  auVar139._0_4_ = fVar210 * auVar48._0_4_;
  auVar139._4_4_ = fVar210 * auVar48._4_4_;
  auVar139._8_4_ = fVar210 * auVar48._8_4_;
  auVar139._12_4_ = fVar210 * auVar48._12_4_;
  auVar49 = vsubps_avx(auVar61,auVar139);
  auVar50 = vrcp14ss_avx512f(auVar115,auVar171);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar50,ZEXT416(0x40000000));
  fVar210 = auVar40._0_4_ * auVar50._0_4_;
  auVar40 = vshufps_avx(auVar52,auVar52,0xff);
  auVar172._0_4_ = fVar214 * auVar40._0_4_;
  auVar172._4_4_ = fVar223 * auVar40._4_4_;
  auVar172._8_4_ = fVar224 * auVar40._8_4_;
  auVar172._12_4_ = fVar225 * auVar40._12_4_;
  local_4f0 = vsubps_avx(auVar52,auVar172);
  auVar50 = vshufps_avx(auVar43,auVar43,0xff);
  auVar62._0_4_ = auVar50._0_4_ * fVar214 + auVar40._0_4_ * fVar124 * fVar199 * auVar4._0_4_;
  auVar62._4_4_ = auVar50._4_4_ * fVar223 + auVar40._4_4_ * fVar124 * fVar199 * auVar4._4_4_;
  auVar62._8_4_ = auVar50._8_4_ * fVar224 + auVar40._8_4_ * fVar124 * fVar199 * auVar4._8_4_;
  auVar62._12_4_ = auVar50._12_4_ * fVar225 + auVar40._12_4_ * fVar124 * fVar199 * auVar4._12_4_;
  auVar4 = vsubps_avx(auVar43,auVar62);
  local_500._0_4_ = auVar172._0_4_ + auVar52._0_4_;
  local_500._4_4_ = auVar172._4_4_ + auVar52._4_4_;
  fStack_4f8 = auVar172._8_4_ + auVar52._8_4_;
  fStack_4f4 = auVar172._12_4_ + auVar52._12_4_;
  auVar40 = vshufps_avx(auVar44,auVar44,0xff);
  auVar149._0_4_ = fVar198 * auVar40._0_4_;
  auVar149._4_4_ = fVar209 * auVar40._4_4_;
  auVar149._8_4_ = fVar211 * auVar40._8_4_;
  auVar149._12_4_ = fVar213 * auVar40._12_4_;
  local_510 = vsubps_avx(auVar44,auVar149);
  auVar50 = vshufps_avx(auVar5,auVar5,0xff);
  auVar45._0_4_ = auVar50._0_4_ * fVar198 + auVar40._0_4_ * fVar103 * auVar49._0_4_ * fVar210;
  auVar45._4_4_ = auVar50._4_4_ * fVar209 + auVar40._4_4_ * fVar103 * auVar49._4_4_ * fVar210;
  auVar45._8_4_ = auVar50._8_4_ * fVar211 + auVar40._8_4_ * fVar103 * auVar49._8_4_ * fVar210;
  auVar45._12_4_ = auVar50._12_4_ * fVar213 + auVar40._12_4_ * fVar103 * auVar49._12_4_ * fVar210;
  auVar40 = vsubps_avx(auVar5,auVar45);
  _local_520 = vaddps_avx512vl(auVar44,auVar149);
  auVar55._0_4_ = auVar4._0_4_ * 0.33333334;
  auVar55._4_4_ = auVar4._4_4_ * 0.33333334;
  auVar55._8_4_ = auVar4._8_4_ * 0.33333334;
  auVar55._12_4_ = auVar4._12_4_ * 0.33333334;
  local_530 = vaddps_avx512vl(local_4f0,auVar55);
  auVar56._0_4_ = auVar40._0_4_ * 0.33333334;
  auVar56._4_4_ = auVar40._4_4_ * 0.33333334;
  auVar56._8_4_ = auVar40._8_4_ * 0.33333334;
  auVar56._12_4_ = auVar40._12_4_ * 0.33333334;
  local_540 = vsubps_avx512vl(local_510,auVar56);
  auVar52._0_4_ = (fVar212 + auVar62._0_4_) * 0.33333334;
  auVar52._4_4_ = (fVar109 + auVar62._4_4_) * 0.33333334;
  auVar52._8_4_ = (fVar110 + auVar62._8_4_) * 0.33333334;
  auVar52._12_4_ = (fVar111 + auVar62._12_4_) * 0.33333334;
  _local_550 = vaddps_avx512vl(_local_500,auVar52);
  auVar41._0_4_ = (fVar123 + auVar45._0_4_) * 0.33333334;
  auVar41._4_4_ = (fVar136 + auVar45._4_4_) * 0.33333334;
  auVar41._8_4_ = (fVar137 + auVar45._8_4_) * 0.33333334;
  auVar41._12_4_ = (fVar138 + auVar45._12_4_) * 0.33333334;
  _local_560 = vsubps_avx512vl(_local_520,auVar41);
  local_470 = vsubps_avx(local_4f0,auVar6);
  uVar112 = local_470._0_4_;
  auVar115._4_4_ = uVar112;
  auVar115._0_4_ = uVar112;
  auVar115._8_4_ = uVar112;
  auVar115._12_4_ = uVar112;
  auVar40 = vshufps_avx(local_470,local_470,0x55);
  auVar50 = vshufps_avx(local_470,local_470,0xaa);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar124 = pre->ray_space[k].vz.field_0.m128[0];
  fVar103 = pre->ray_space[k].vz.field_0.m128[1];
  fVar199 = pre->ray_space[k].vz.field_0.m128[2];
  fVar210 = pre->ray_space[k].vz.field_0.m128[3];
  auVar43._0_4_ = fVar124 * auVar50._0_4_;
  auVar43._4_4_ = fVar103 * auVar50._4_4_;
  auVar43._8_4_ = fVar199 * auVar50._8_4_;
  auVar43._12_4_ = fVar210 * auVar50._12_4_;
  auVar40 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar3,auVar40);
  auVar42 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar115);
  local_480 = vsubps_avx512vl(local_530,auVar6);
  uVar112 = local_480._0_4_;
  auVar59._4_4_ = uVar112;
  auVar59._0_4_ = uVar112;
  auVar59._8_4_ = uVar112;
  auVar59._12_4_ = uVar112;
  auVar40 = vshufps_avx(local_480,local_480,0x55);
  auVar50 = vshufps_avx(local_480,local_480,0xaa);
  auVar60._0_4_ = fVar124 * auVar50._0_4_;
  auVar60._4_4_ = fVar103 * auVar50._4_4_;
  auVar60._8_4_ = fVar199 * auVar50._8_4_;
  auVar60._12_4_ = fVar210 * auVar50._12_4_;
  auVar40 = vfmadd231ps_fma(auVar60,(undefined1  [16])aVar3,auVar40);
  auVar52 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar59);
  local_490 = vsubps_avx512vl(local_540,auVar6);
  uVar112 = local_490._0_4_;
  auVar158._4_4_ = uVar112;
  auVar158._0_4_ = uVar112;
  auVar158._8_4_ = uVar112;
  auVar158._12_4_ = uVar112;
  auVar40 = vshufps_avx(local_490,local_490,0x55);
  auVar50 = vshufps_avx(local_490,local_490,0xaa);
  auVar57._0_4_ = fVar124 * auVar50._0_4_;
  auVar57._4_4_ = fVar103 * auVar50._4_4_;
  auVar57._8_4_ = fVar199 * auVar50._8_4_;
  auVar57._12_4_ = fVar210 * auVar50._12_4_;
  auVar40 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar3,auVar40);
  auVar44 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar158);
  local_4a0 = vsubps_avx(local_510,auVar6);
  uVar112 = local_4a0._0_4_;
  auVar159._4_4_ = uVar112;
  auVar159._0_4_ = uVar112;
  auVar159._8_4_ = uVar112;
  auVar159._12_4_ = uVar112;
  auVar40 = vshufps_avx(local_4a0,local_4a0,0x55);
  auVar50 = vshufps_avx(local_4a0,local_4a0,0xaa);
  auVar181._0_4_ = auVar50._0_4_ * fVar124;
  auVar181._4_4_ = auVar50._4_4_ * fVar103;
  auVar181._8_4_ = auVar50._8_4_ * fVar199;
  auVar181._12_4_ = auVar50._12_4_ * fVar210;
  auVar40 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar3,auVar40);
  auVar41 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar159);
  local_4b0 = vsubps_avx(_local_500,auVar6);
  uVar112 = local_4b0._0_4_;
  auVar160._4_4_ = uVar112;
  auVar160._0_4_ = uVar112;
  auVar160._8_4_ = uVar112;
  auVar160._12_4_ = uVar112;
  auVar40 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar50 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar192._0_4_ = auVar50._0_4_ * fVar124;
  auVar192._4_4_ = auVar50._4_4_ * fVar103;
  auVar192._8_4_ = auVar50._8_4_ * fVar199;
  auVar192._12_4_ = auVar50._12_4_ * fVar210;
  auVar40 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar3,auVar40);
  auVar43 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar160);
  local_4c0 = vsubps_avx512vl(_local_550,auVar6);
  uVar112 = local_4c0._0_4_;
  auVar161._4_4_ = uVar112;
  auVar161._0_4_ = uVar112;
  auVar161._8_4_ = uVar112;
  auVar161._12_4_ = uVar112;
  auVar40 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar50 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar200._0_4_ = auVar50._0_4_ * fVar124;
  auVar200._4_4_ = auVar50._4_4_ * fVar103;
  auVar200._8_4_ = auVar50._8_4_ * fVar199;
  auVar200._12_4_ = auVar50._12_4_ * fVar210;
  auVar40 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar3,auVar40);
  auVar45 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar161);
  local_4d0 = vsubps_avx512vl(_local_560,auVar6);
  uVar112 = local_4d0._0_4_;
  auVar162._4_4_ = uVar112;
  auVar162._0_4_ = uVar112;
  auVar162._8_4_ = uVar112;
  auVar162._12_4_ = uVar112;
  auVar40 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar50 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar216._0_4_ = auVar50._0_4_ * fVar124;
  auVar216._4_4_ = auVar50._4_4_ * fVar103;
  auVar216._8_4_ = auVar50._8_4_ * fVar199;
  auVar216._12_4_ = auVar50._12_4_ * fVar210;
  auVar40 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar3,auVar40);
  auVar115 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar162);
  local_4e0 = vsubps_avx512vl(_local_520,auVar6);
  uVar112 = local_4e0._0_4_;
  auVar51._4_4_ = uVar112;
  auVar51._0_4_ = uVar112;
  auVar51._8_4_ = uVar112;
  auVar51._12_4_ = uVar112;
  auVar40 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar50 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar150._0_4_ = auVar50._0_4_ * fVar124;
  auVar150._4_4_ = auVar50._4_4_ * fVar103;
  auVar150._8_4_ = auVar50._8_4_ * fVar199;
  auVar150._12_4_ = auVar50._12_4_ * fVar210;
  auVar40 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar3,auVar40);
  auVar6 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar51);
  auVar4 = vmovlhps_avx(auVar42,auVar43);
  auVar47 = vmovlhps_avx512f(auVar52,auVar45);
  auVar5 = vmovlhps_avx512f(auVar44,auVar115);
  auVar46 = vmovlhps_avx512f(auVar41,auVar6);
  auVar40 = vminps_avx512vl(auVar4,auVar47);
  auVar49 = vmaxps_avx512vl(auVar4,auVar47);
  auVar50 = vminps_avx512vl(auVar5,auVar46);
  auVar50 = vminps_avx(auVar40,auVar50);
  auVar40 = vmaxps_avx512vl(auVar5,auVar46);
  auVar40 = vmaxps_avx(auVar49,auVar40);
  auVar49 = vshufpd_avx(auVar50,auVar50,3);
  auVar48 = vshufpd_avx(auVar40,auVar40,3);
  auVar50 = vminps_avx(auVar50,auVar49);
  auVar40 = vmaxps_avx(auVar40,auVar48);
  auVar50 = vandps_avx512vl(auVar50,auVar239._0_16_);
  auVar40 = vandps_avx512vl(auVar40,auVar239._0_16_);
  auVar40 = vmaxps_avx(auVar50,auVar40);
  auVar50 = vmovshdup_avx(auVar40);
  auVar40 = vmaxss_avx(auVar50,auVar40);
  fVar124 = auVar40._0_4_ * 9.536743e-07;
  auVar163._8_8_ = auVar42._0_8_;
  auVar163._0_8_ = auVar42._0_8_;
  auVar50 = vmovddup_avx512vl(auVar52);
  auVar49 = vmovddup_avx512vl(auVar44);
  auVar113._8_8_ = auVar41._0_8_;
  auVar113._0_8_ = auVar41._0_8_;
  local_440 = vbroadcastss_avx512vl(ZEXT416((uint)fVar124));
  auVar40 = vxorps_avx512vl(local_440._0_16_,auVar240._0_16_);
  auVar69 = vbroadcastss_avx512vl(auVar40);
  auVar108 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar108);
  bVar35 = false;
  uVar25 = 0;
  uVar1 = *(uint *)(ray + k * 4 + 0xc0);
  auVar86._0_16_ = vsubps_avx512vl(auVar47,auVar4);
  local_450 = vsubps_avx512vl(auVar5,auVar47);
  local_460 = vsubps_avx512vl(auVar46,auVar5);
  local_570 = vsubps_avx(_local_500,local_4f0);
  local_580 = vsubps_avx512vl(_local_550,local_530);
  local_590 = vsubps_avx512vl(_local_560,local_540);
  _local_5a0 = vsubps_avx512vl(_local_520,local_510);
  auVar108 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar108);
  auVar40 = ZEXT816(0x3f80000000000000);
  auVar101._32_32_ = auVar108._32_32_;
  auVar42 = auVar40;
LAB_01cd2dc8:
  do {
    auVar48 = vshufps_avx(auVar42,auVar42,0x50);
    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar44 = vsubps_avx512vl(auVar70._0_16_,auVar48);
    fVar103 = auVar48._0_4_;
    fVar109 = auVar43._0_4_;
    auVar131._0_4_ = fVar109 * fVar103;
    fVar199 = auVar48._4_4_;
    fVar110 = auVar43._4_4_;
    auVar131._4_4_ = fVar110 * fVar199;
    fVar210 = auVar48._8_4_;
    auVar131._8_4_ = fVar109 * fVar210;
    fVar212 = auVar48._12_4_;
    auVar131._12_4_ = fVar110 * fVar212;
    fVar111 = auVar45._0_4_;
    auVar140._0_4_ = fVar111 * fVar103;
    fVar123 = auVar45._4_4_;
    auVar140._4_4_ = fVar123 * fVar199;
    auVar140._8_4_ = fVar111 * fVar210;
    auVar140._12_4_ = fVar123 * fVar212;
    fVar136 = auVar115._0_4_;
    auVar151._0_4_ = fVar136 * fVar103;
    fVar137 = auVar115._4_4_;
    auVar151._4_4_ = fVar137 * fVar199;
    auVar151._8_4_ = fVar136 * fVar210;
    auVar151._12_4_ = fVar137 * fVar212;
    fVar138 = auVar6._0_4_;
    auVar116._0_4_ = fVar138 * fVar103;
    fVar198 = auVar6._4_4_;
    auVar116._4_4_ = fVar198 * fVar199;
    auVar116._8_4_ = fVar138 * fVar210;
    auVar116._12_4_ = fVar198 * fVar212;
    auVar52 = vfmadd231ps_fma(auVar131,auVar44,auVar163);
    auVar41 = vfmadd231ps_avx512vl(auVar140,auVar44,auVar50);
    auVar51 = vfmadd231ps_avx512vl(auVar151,auVar44,auVar49);
    auVar44 = vfmadd231ps_fma(auVar116,auVar113,auVar44);
    auVar48 = vmovshdup_avx(auVar40);
    fVar199 = auVar40._0_4_;
    fVar103 = (auVar48._0_4_ - fVar199) * 0.04761905;
    auVar177._4_4_ = fVar199;
    auVar177._0_4_ = fVar199;
    auVar177._8_4_ = fVar199;
    auVar177._12_4_ = fVar199;
    auVar177._16_4_ = fVar199;
    auVar177._20_4_ = fVar199;
    auVar177._24_4_ = fVar199;
    auVar177._28_4_ = fVar199;
    auVar129._0_8_ = auVar48._0_8_;
    auVar129._8_8_ = auVar129._0_8_;
    auVar129._16_8_ = auVar129._0_8_;
    auVar129._24_8_ = auVar129._0_8_;
    auVar67 = vsubps_avx(auVar129,auVar177);
    uVar112 = auVar52._0_4_;
    auVar130._4_4_ = uVar112;
    auVar130._0_4_ = uVar112;
    auVar130._8_4_ = uVar112;
    auVar130._12_4_ = uVar112;
    auVar130._16_4_ = uVar112;
    auVar130._20_4_ = uVar112;
    auVar130._24_4_ = uVar112;
    auVar130._28_4_ = uVar112;
    auVar195._8_4_ = 1;
    auVar195._0_8_ = 0x100000001;
    auVar195._12_4_ = 1;
    auVar195._16_4_ = 1;
    auVar195._20_4_ = 1;
    auVar195._24_4_ = 1;
    auVar195._28_4_ = 1;
    auVar81 = ZEXT1632(auVar52);
    auVar80 = vpermps_avx2(auVar195,auVar81);
    auVar71 = vbroadcastss_avx512vl(auVar41);
    auVar82 = ZEXT1632(auVar41);
    auVar72 = vpermps_avx512vl(auVar195,auVar82);
    auVar73 = vbroadcastss_avx512vl(auVar51);
    auVar68 = ZEXT1632(auVar51);
    auVar66 = vpermps_avx512vl(auVar195,auVar68);
    auVar74 = vbroadcastss_avx512vl(auVar44);
    auVar78 = ZEXT1632(auVar44);
    auVar75 = vpermps_avx512vl(auVar195,auVar78);
    auVar196._4_4_ = fVar103;
    auVar196._0_4_ = fVar103;
    auVar196._8_4_ = fVar103;
    auVar196._12_4_ = fVar103;
    auVar196._16_4_ = fVar103;
    auVar196._20_4_ = fVar103;
    auVar196._24_4_ = fVar103;
    auVar196._28_4_ = fVar103;
    auVar232._8_4_ = 2;
    auVar232._0_8_ = 0x200000002;
    auVar232._12_4_ = 2;
    auVar232._16_4_ = 2;
    auVar232._20_4_ = 2;
    auVar232._24_4_ = 2;
    auVar232._28_4_ = 2;
    auVar64 = vpermps_avx512vl(auVar232,auVar81);
    auVar170._8_4_ = 3;
    auVar170._0_8_ = 0x300000003;
    auVar170._12_4_ = 3;
    auVar170._16_4_ = 3;
    auVar170._20_4_ = 3;
    auVar170._24_4_ = 3;
    auVar170._28_4_ = 3;
    auVar65 = vpermps_avx512vl(auVar170,auVar81);
    auVar76 = vpermps_avx512vl(auVar232,auVar82);
    auVar81 = vpermps_avx2(auVar170,auVar82);
    auVar82 = vpermps_avx2(auVar232,auVar68);
    auVar68 = vpermps_avx2(auVar170,auVar68);
    auVar77 = vpermps_avx512vl(auVar232,auVar78);
    auVar78 = vpermps_avx512vl(auVar170,auVar78);
    auVar48 = vfmadd132ps_fma(auVar67,auVar177,_DAT_01faff20);
    auVar70 = vsubps_avx512vl(auVar70,ZEXT1632(auVar48));
    auVar67 = vmulps_avx512vl(auVar71,ZEXT1632(auVar48));
    auVar83 = ZEXT1632(auVar48);
    auVar79 = vmulps_avx512vl(auVar72,auVar83);
    auVar52 = vfmadd231ps_fma(auVar67,auVar70,auVar130);
    auVar44 = vfmadd231ps_fma(auVar79,auVar70,auVar80);
    auVar67 = vmulps_avx512vl(auVar73,auVar83);
    auVar79 = vmulps_avx512vl(auVar66,auVar83);
    auVar67 = vfmadd231ps_avx512vl(auVar67,auVar70,auVar71);
    auVar71 = vfmadd231ps_avx512vl(auVar79,auVar70,auVar72);
    auVar72 = vmulps_avx512vl(auVar74,auVar83);
    auVar79 = ZEXT1632(auVar48);
    auVar75 = vmulps_avx512vl(auVar75,auVar79);
    auVar72 = vfmadd231ps_avx512vl(auVar72,auVar70,auVar73);
    auVar73 = vfmadd231ps_avx512vl(auVar75,auVar70,auVar66);
    fVar210 = auVar48._0_4_;
    fVar212 = auVar48._4_4_;
    auVar19._4_4_ = fVar212 * auVar67._4_4_;
    auVar19._0_4_ = fVar210 * auVar67._0_4_;
    fVar209 = auVar48._8_4_;
    auVar19._8_4_ = fVar209 * auVar67._8_4_;
    fVar211 = auVar48._12_4_;
    auVar19._12_4_ = fVar211 * auVar67._12_4_;
    auVar19._16_4_ = auVar67._16_4_ * 0.0;
    auVar19._20_4_ = auVar67._20_4_ * 0.0;
    auVar19._24_4_ = auVar67._24_4_ * 0.0;
    auVar19._28_4_ = fVar199;
    auVar20._4_4_ = fVar212 * auVar71._4_4_;
    auVar20._0_4_ = fVar210 * auVar71._0_4_;
    auVar20._8_4_ = fVar209 * auVar71._8_4_;
    auVar20._12_4_ = fVar211 * auVar71._12_4_;
    auVar20._16_4_ = auVar71._16_4_ * 0.0;
    auVar20._20_4_ = auVar71._20_4_ * 0.0;
    auVar20._24_4_ = auVar71._24_4_ * 0.0;
    auVar20._28_4_ = auVar80._28_4_;
    auVar52 = vfmadd231ps_fma(auVar19,auVar70,ZEXT1632(auVar52));
    auVar44 = vfmadd231ps_fma(auVar20,auVar70,ZEXT1632(auVar44));
    auVar121._0_4_ = fVar210 * auVar72._0_4_;
    auVar121._4_4_ = fVar212 * auVar72._4_4_;
    auVar121._8_4_ = fVar209 * auVar72._8_4_;
    auVar121._12_4_ = fVar211 * auVar72._12_4_;
    auVar121._16_4_ = auVar72._16_4_ * 0.0;
    auVar121._20_4_ = auVar72._20_4_ * 0.0;
    auVar121._24_4_ = auVar72._24_4_ * 0.0;
    auVar121._28_4_ = 0;
    auVar21._4_4_ = fVar212 * auVar73._4_4_;
    auVar21._0_4_ = fVar210 * auVar73._0_4_;
    auVar21._8_4_ = fVar209 * auVar73._8_4_;
    auVar21._12_4_ = fVar211 * auVar73._12_4_;
    auVar21._16_4_ = auVar73._16_4_ * 0.0;
    auVar21._20_4_ = auVar73._20_4_ * 0.0;
    auVar21._24_4_ = auVar73._24_4_ * 0.0;
    auVar21._28_4_ = auVar72._28_4_;
    auVar41 = vfmadd231ps_fma(auVar121,auVar70,auVar67);
    auVar51 = vfmadd231ps_fma(auVar21,auVar70,auVar71);
    auVar22._28_4_ = auVar71._28_4_;
    auVar22._0_28_ =
         ZEXT1628(CONCAT412(fVar211 * auVar51._12_4_,
                            CONCAT48(fVar209 * auVar51._8_4_,
                                     CONCAT44(fVar212 * auVar51._4_4_,fVar210 * auVar51._0_4_))));
    auVar60 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar211 * auVar41._12_4_,
                                                 CONCAT48(fVar209 * auVar41._8_4_,
                                                          CONCAT44(fVar212 * auVar41._4_4_,
                                                                   fVar210 * auVar41._0_4_)))),
                              auVar70,ZEXT1632(auVar52));
    auVar63 = vfmadd231ps_fma(auVar22,auVar70,ZEXT1632(auVar44));
    auVar67 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar52));
    auVar80 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar44));
    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar67 = vmulps_avx512vl(auVar67,auVar71);
    auVar80 = vmulps_avx512vl(auVar80,auVar71);
    auVar190._0_4_ = fVar103 * auVar67._0_4_;
    auVar190._4_4_ = fVar103 * auVar67._4_4_;
    auVar190._8_4_ = fVar103 * auVar67._8_4_;
    auVar190._12_4_ = fVar103 * auVar67._12_4_;
    auVar190._16_4_ = fVar103 * auVar67._16_4_;
    auVar190._20_4_ = fVar103 * auVar67._20_4_;
    auVar190._24_4_ = fVar103 * auVar67._24_4_;
    auVar190._28_4_ = 0;
    auVar67 = vmulps_avx512vl(auVar196,auVar80);
    auVar44 = vxorps_avx512vl(auVar74._0_16_,auVar74._0_16_);
    auVar72 = vpermt2ps_avx512vl(ZEXT1632(auVar60),_DAT_01feed00,ZEXT1632(auVar44));
    auVar73 = vpermt2ps_avx512vl(ZEXT1632(auVar63),_DAT_01feed00,ZEXT1632(auVar44));
    auVar122._0_4_ = auVar190._0_4_ + auVar60._0_4_;
    auVar122._4_4_ = auVar190._4_4_ + auVar60._4_4_;
    auVar122._8_4_ = auVar190._8_4_ + auVar60._8_4_;
    auVar122._12_4_ = auVar190._12_4_ + auVar60._12_4_;
    auVar122._16_4_ = auVar190._16_4_ + 0.0;
    auVar122._20_4_ = auVar190._20_4_ + 0.0;
    auVar122._24_4_ = auVar190._24_4_ + 0.0;
    auVar122._28_4_ = 0;
    auVar83 = ZEXT1632(auVar44);
    auVar80 = vpermt2ps_avx512vl(auVar190,_DAT_01feed00,auVar83);
    auVar66 = vaddps_avx512vl(ZEXT1632(auVar63),auVar67);
    auVar74 = vpermt2ps_avx512vl(auVar67,_DAT_01feed00,auVar83);
    auVar67 = vsubps_avx(auVar72,auVar80);
    auVar74 = vsubps_avx512vl(auVar73,auVar74);
    auVar80 = vmulps_avx512vl(auVar76,auVar79);
    auVar75 = vmulps_avx512vl(auVar81,auVar79);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar70,auVar64);
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar70,auVar65);
    auVar64 = vmulps_avx512vl(auVar82,auVar79);
    auVar65 = vmulps_avx512vl(auVar68,auVar79);
    auVar64 = vfmadd231ps_avx512vl(auVar64,auVar70,auVar76);
    auVar81 = vfmadd231ps_avx512vl(auVar65,auVar70,auVar81);
    auVar65 = vmulps_avx512vl(auVar77,auVar79);
    auVar76 = vmulps_avx512vl(auVar78,auVar79);
    auVar52 = vfmadd231ps_fma(auVar65,auVar70,auVar82);
    auVar82 = vfmadd231ps_avx512vl(auVar76,auVar70,auVar68);
    auVar65 = vmulps_avx512vl(auVar79,auVar64);
    auVar77 = ZEXT1632(auVar48);
    auVar76 = vmulps_avx512vl(auVar77,auVar81);
    auVar80 = vfmadd231ps_avx512vl(auVar65,auVar70,auVar80);
    auVar75 = vfmadd231ps_avx512vl(auVar76,auVar70,auVar75);
    auVar82 = vmulps_avx512vl(auVar77,auVar82);
    auVar64 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar211 * auVar52._12_4_,
                                            CONCAT48(fVar209 * auVar52._8_4_,
                                                     CONCAT44(fVar212 * auVar52._4_4_,
                                                              fVar210 * auVar52._0_4_)))),auVar70,
                         auVar64);
    auVar81 = vfmadd231ps_avx512vl(auVar82,auVar70,auVar81);
    auVar23._4_4_ = fVar212 * auVar64._4_4_;
    auVar23._0_4_ = fVar210 * auVar64._0_4_;
    auVar23._8_4_ = fVar209 * auVar64._8_4_;
    auVar23._12_4_ = fVar211 * auVar64._12_4_;
    auVar23._16_4_ = auVar64._16_4_ * 0.0;
    auVar23._20_4_ = auVar64._20_4_ * 0.0;
    auVar23._24_4_ = auVar64._24_4_ * 0.0;
    auVar23._28_4_ = auVar68._28_4_;
    auVar82 = vmulps_avx512vl(auVar77,auVar81);
    auVar68 = vfmadd231ps_avx512vl(auVar23,auVar70,auVar80);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar75,auVar70);
    auVar80 = vsubps_avx512vl(auVar64,auVar80);
    auVar81 = vsubps_avx512vl(auVar81,auVar75);
    auVar80 = vmulps_avx512vl(auVar80,auVar71);
    auVar81 = vmulps_avx512vl(auVar81,auVar71);
    fVar199 = fVar103 * auVar80._0_4_;
    fVar210 = fVar103 * auVar80._4_4_;
    auVar24._4_4_ = fVar210;
    auVar24._0_4_ = fVar199;
    fVar212 = fVar103 * auVar80._8_4_;
    auVar24._8_4_ = fVar212;
    fVar209 = fVar103 * auVar80._12_4_;
    auVar24._12_4_ = fVar209;
    fVar211 = fVar103 * auVar80._16_4_;
    auVar24._16_4_ = fVar211;
    fVar213 = fVar103 * auVar80._20_4_;
    auVar24._20_4_ = fVar213;
    fVar103 = fVar103 * auVar80._24_4_;
    auVar24._24_4_ = fVar103;
    auVar24._28_4_ = auVar80._28_4_;
    auVar81 = vmulps_avx512vl(auVar196,auVar81);
    auVar70 = vpermt2ps_avx512vl(auVar68,_DAT_01feed00,auVar83);
    auVar71 = vpermt2ps_avx512vl(auVar82,_DAT_01feed00,auVar83);
    auVar197._0_4_ = auVar68._0_4_ + fVar199;
    auVar197._4_4_ = auVar68._4_4_ + fVar210;
    auVar197._8_4_ = auVar68._8_4_ + fVar212;
    auVar197._12_4_ = auVar68._12_4_ + fVar209;
    auVar197._16_4_ = auVar68._16_4_ + fVar211;
    auVar197._20_4_ = auVar68._20_4_ + fVar213;
    auVar197._24_4_ = auVar68._24_4_ + fVar103;
    auVar197._28_4_ = auVar68._28_4_ + auVar80._28_4_;
    auVar80 = vpermt2ps_avx512vl(auVar24,_DAT_01feed00,ZEXT1632(auVar44));
    auVar75 = vaddps_avx512vl(auVar82,auVar81);
    auVar81 = vpermt2ps_avx512vl(auVar81,_DAT_01feed00,ZEXT1632(auVar44));
    auVar80 = vsubps_avx(auVar70,auVar80);
    auVar81 = vsubps_avx512vl(auVar71,auVar81);
    auVar134 = ZEXT1632(auVar60);
    auVar64 = vsubps_avx512vl(auVar68,auVar134);
    auVar146 = ZEXT1632(auVar63);
    auVar65 = vsubps_avx512vl(auVar82,auVar146);
    auVar76 = vsubps_avx512vl(auVar70,auVar72);
    auVar64 = vaddps_avx512vl(auVar64,auVar76);
    auVar76 = vsubps_avx512vl(auVar71,auVar73);
    auVar65 = vaddps_avx512vl(auVar65,auVar76);
    auVar76 = vmulps_avx512vl(auVar146,auVar64);
    auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar134,auVar65);
    auVar77 = vmulps_avx512vl(auVar66,auVar64);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar122,auVar65);
    auVar78 = vmulps_avx512vl(auVar74,auVar64);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar67,auVar65);
    auVar79 = vmulps_avx512vl(auVar73,auVar64);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar72,auVar65);
    auVar83 = vmulps_avx512vl(auVar82,auVar64);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar68,auVar65);
    auVar84 = vmulps_avx512vl(auVar75,auVar64);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar197,auVar65);
    auVar85 = vmulps_avx512vl(auVar81,auVar64);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar80,auVar65);
    auVar64 = vmulps_avx512vl(auVar71,auVar64);
    auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar70,auVar65);
    auVar65 = vminps_avx512vl(auVar76,auVar77);
    auVar76 = vmaxps_avx512vl(auVar76,auVar77);
    auVar77 = vminps_avx512vl(auVar78,auVar79);
    auVar65 = vminps_avx512vl(auVar65,auVar77);
    auVar77 = vmaxps_avx512vl(auVar78,auVar79);
    auVar76 = vmaxps_avx512vl(auVar76,auVar77);
    auVar77 = vminps_avx512vl(auVar83,auVar84);
    auVar78 = vmaxps_avx512vl(auVar83,auVar84);
    auVar79 = vminps_avx512vl(auVar85,auVar64);
    auVar77 = vminps_avx512vl(auVar77,auVar79);
    auVar65 = vminps_avx512vl(auVar65,auVar77);
    auVar64 = vmaxps_avx512vl(auVar85,auVar64);
    auVar64 = vmaxps_avx512vl(auVar78,auVar64);
    auVar64 = vmaxps_avx512vl(auVar76,auVar64);
    uVar13 = vcmpps_avx512vl(auVar65,local_440,2);
    uVar14 = vcmpps_avx512vl(auVar64,auVar69,5);
    bVar29 = (byte)uVar13 & (byte)uVar14 & 0x7f;
    auVar245 = ZEXT3264(auVar69);
    if (bVar29 == 0) {
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar52 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar108._32_32_ = auVar101._32_32_;
      auVar108._0_32_ = _DAT_01feed20;
      auVar102 = auVar108._16_48_;
    }
    else {
      auVar64 = vsubps_avx512vl(auVar72,auVar134);
      auVar65 = vsubps_avx512vl(auVar73,auVar146);
      auVar76 = vsubps_avx512vl(auVar70,auVar68);
      auVar64 = vaddps_avx512vl(auVar64,auVar76);
      auVar76 = vsubps_avx512vl(auVar71,auVar82);
      auVar65 = vaddps_avx512vl(auVar65,auVar76);
      auVar76 = vmulps_avx512vl(auVar146,auVar64);
      auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar65,auVar134);
      auVar66 = vmulps_avx512vl(auVar66,auVar64);
      auVar66 = vfnmadd213ps_avx512vl(auVar122,auVar65,auVar66);
      auVar74 = vmulps_avx512vl(auVar74,auVar64);
      auVar74 = vfnmadd213ps_avx512vl(auVar67,auVar65,auVar74);
      auVar67 = vmulps_avx512vl(auVar73,auVar64);
      auVar72 = vfnmadd231ps_avx512vl(auVar67,auVar65,auVar72);
      auVar67 = vmulps_avx512vl(auVar82,auVar64);
      auVar68 = vfnmadd231ps_avx512vl(auVar67,auVar65,auVar68);
      auVar67 = vmulps_avx512vl(auVar75,auVar64);
      auVar73 = vfnmadd213ps_avx512vl(auVar197,auVar65,auVar67);
      auVar67 = vmulps_avx512vl(auVar81,auVar64);
      auVar75 = vfnmadd213ps_avx512vl(auVar80,auVar65,auVar67);
      auVar67 = vmulps_avx512vl(auVar71,auVar64);
      auVar70 = vfnmadd231ps_avx512vl(auVar67,auVar70,auVar65);
      auVar80 = vminps_avx(auVar76,auVar66);
      auVar67 = vmaxps_avx(auVar76,auVar66);
      auVar81 = vminps_avx(auVar74,auVar72);
      auVar81 = vminps_avx(auVar80,auVar81);
      auVar80 = vmaxps_avx(auVar74,auVar72);
      auVar67 = vmaxps_avx(auVar67,auVar80);
      auVar82 = vminps_avx(auVar68,auVar73);
      auVar80 = vmaxps_avx(auVar68,auVar73);
      auVar68 = vminps_avx(auVar75,auVar70);
      auVar82 = vminps_avx(auVar82,auVar68);
      auVar82 = vminps_avx(auVar81,auVar82);
      auVar81 = vmaxps_avx(auVar75,auVar70);
      auVar80 = vmaxps_avx(auVar80,auVar81);
      auVar67 = vmaxps_avx(auVar67,auVar80);
      uVar13 = vcmpps_avx512vl(auVar67,auVar69,5);
      uVar14 = vcmpps_avx512vl(auVar82,local_440,2);
      bVar29 = bVar29 & (byte)uVar13 & (byte)uVar14;
      if (bVar29 != 0) {
        auStack_600[uVar25] = (uint)bVar29;
        uVar13 = vmovlps_avx(auVar40);
        (&uStack_420)[uVar25] = uVar13;
        uVar33 = vmovlps_avx(auVar42);
        auStack_3a0[uVar25] = uVar33;
        uVar25 = (ulong)((int)uVar25 + 1);
      }
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar52 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar239._32_32_ = auVar101._32_32_;
      auVar239._0_32_ = _DAT_01feed20;
      auVar102 = auVar239._16_48_;
    }
    auVar244 = ZEXT3264(_DAT_01feed20);
    auVar243 = ZEXT1664(auVar40);
    auVar242 = ZEXT1664(auVar48);
    auVar241 = ZEXT3264(auVar69);
    auVar240 = ZEXT1664(auVar42);
    auVar239 = ZEXT1664(auVar52);
    auVar108 = ZEXT1664(auVar44);
    auVar86._16_48_ = auVar102;
    auVar87 = auVar86;
LAB_01cd3363:
    do {
      do {
        auVar69 = auVar245._0_32_;
        if ((int)uVar25 == 0) {
          if (bVar35) {
            return bVar35;
          }
          uVar112 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar18._4_4_ = uVar112;
          auVar18._0_4_ = uVar112;
          auVar18._8_4_ = uVar112;
          auVar18._12_4_ = uVar112;
          auVar18._16_4_ = uVar112;
          auVar18._20_4_ = uVar112;
          auVar18._24_4_ = uVar112;
          auVar18._28_4_ = uVar112;
          uVar13 = vcmpps_avx512vl(local_3c0,auVar18,2);
          uVar34 = (uint)uVar32 & (uint)uVar13;
          uVar32 = (ulong)uVar34;
          if (uVar34 == 0) {
            return bVar35;
          }
          goto LAB_01cd2641;
        }
        uVar30 = (int)uVar25 - 1;
        uVar31 = (ulong)uVar30;
        uVar8 = auStack_600[uVar31];
        auVar42._8_8_ = 0;
        auVar42._0_8_ = auStack_3a0[uVar31];
        uVar33 = 0;
        for (uVar27 = (ulong)uVar8; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
          uVar33 = uVar33 + 1;
        }
        uVar26 = uVar8 - 1 & uVar8;
        bVar38 = uVar26 == 0;
        auStack_600[uVar31] = uVar26;
        if (bVar38) {
          uVar25 = (ulong)uVar30;
        }
        auVar104._8_8_ = 0;
        auVar104._0_8_ = uVar33;
        auVar40 = vpunpcklqdq_avx(auVar104,ZEXT416((int)uVar33 + 1));
        auVar40 = vcvtqq2ps_avx512vl(auVar40);
        auVar40 = vmulps_avx512vl(auVar40,auVar242._0_16_);
        uVar112 = *(undefined4 *)((long)&uStack_420 + uVar31 * 8 + 4);
        auVar15._4_4_ = uVar112;
        auVar15._0_4_ = uVar112;
        auVar15._8_4_ = uVar112;
        auVar15._12_4_ = uVar112;
        auVar48 = vmulps_avx512vl(auVar40,auVar15);
        auVar52 = auVar243._0_16_;
        auVar40 = vsubps_avx512vl(auVar52,auVar40);
        uVar112 = *(undefined4 *)(&uStack_420 + uVar31);
        auVar16._4_4_ = uVar112;
        auVar16._0_4_ = uVar112;
        auVar16._8_4_ = uVar112;
        auVar16._12_4_ = uVar112;
        auVar40 = vfmadd231ps_avx512vl(auVar48,auVar40,auVar16);
        auVar48 = vmovshdup_avx(auVar40);
        fVar103 = auVar48._0_4_ - auVar40._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar103));
        auVar101._32_32_ = auVar87._32_32_;
        if (uVar8 == 0 || bVar38) goto LAB_01cd2dc8;
        auVar48 = vshufps_avx(auVar42,auVar42,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar103));
        auVar51 = vsubps_avx512vl(auVar52,auVar48);
        fVar199 = auVar48._0_4_;
        auVar141._0_4_ = fVar199 * fVar109;
        fVar210 = auVar48._4_4_;
        auVar141._4_4_ = fVar210 * fVar110;
        fVar212 = auVar48._8_4_;
        auVar141._8_4_ = fVar212 * fVar109;
        fVar209 = auVar48._12_4_;
        auVar141._12_4_ = fVar209 * fVar110;
        auVar152._0_4_ = fVar199 * fVar111;
        auVar152._4_4_ = fVar210 * fVar123;
        auVar152._8_4_ = fVar212 * fVar111;
        auVar152._12_4_ = fVar209 * fVar123;
        auVar164._0_4_ = fVar136 * fVar199;
        auVar164._4_4_ = fVar137 * fVar210;
        auVar164._8_4_ = fVar136 * fVar212;
        auVar164._12_4_ = fVar137 * fVar209;
        auVar125._0_4_ = fVar138 * fVar199;
        auVar125._4_4_ = fVar198 * fVar210;
        auVar125._8_4_ = fVar138 * fVar212;
        auVar125._12_4_ = fVar198 * fVar209;
        auVar48 = vfmadd231ps_fma(auVar141,auVar51,auVar163);
        auVar44 = vfmadd231ps_fma(auVar152,auVar51,auVar50);
        auVar41 = vfmadd231ps_fma(auVar164,auVar51,auVar49);
        auVar51 = vfmadd231ps_fma(auVar125,auVar113,auVar51);
        auVar135._16_16_ = auVar48;
        auVar135._0_16_ = auVar48;
        auVar147._16_16_ = auVar44;
        auVar147._0_16_ = auVar44;
        auVar156._16_16_ = auVar41;
        auVar156._0_16_ = auVar41;
        auVar80 = vpermps_avx512vl(auVar244._0_32_,ZEXT1632(auVar40));
        auVar67 = vsubps_avx(auVar147,auVar135);
        auVar44 = vfmadd213ps_fma(auVar67,auVar80,auVar135);
        auVar67 = vsubps_avx(auVar156,auVar147);
        auVar60 = vfmadd213ps_fma(auVar67,auVar80,auVar147);
        auVar48 = vsubps_avx(auVar51,auVar41);
        auVar148._16_16_ = auVar48;
        auVar148._0_16_ = auVar48;
        auVar48 = vfmadd213ps_fma(auVar148,auVar80,auVar156);
        auVar67 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar44));
        auVar44 = vfmadd213ps_fma(auVar67,auVar80,ZEXT1632(auVar44));
        auVar67 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar60));
        auVar48 = vfmadd213ps_fma(auVar67,auVar80,ZEXT1632(auVar60));
        auVar67 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar44));
        auVar139 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar67,auVar80);
        auVar101._0_32_ = vmulps_avx512vl(auVar67,auVar241._0_32_);
        fVar199 = fVar103 * 0.33333334;
        auVar165._0_8_ =
             CONCAT44(auVar139._4_4_ + fVar199 * auVar101._4_4_,
                      auVar139._0_4_ + fVar199 * auVar101._0_4_);
        auVar165._8_4_ = auVar139._8_4_ + fVar199 * auVar101._8_4_;
        auVar165._12_4_ = auVar139._12_4_ + fVar199 * auVar101._12_4_;
        auVar142._0_4_ = fVar199 * auVar101._16_4_;
        auVar142._4_4_ = fVar199 * auVar101._20_4_;
        auVar142._8_4_ = fVar199 * auVar101._24_4_;
        auVar142._12_4_ = fVar199 * auVar101._28_4_;
        auVar59 = vsubps_avx((undefined1  [16])0x0,auVar142);
        auVar60 = vshufpd_avx(auVar139,auVar139,3);
        auVar63 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar48 = vsubps_avx(auVar60,auVar139);
        auVar44 = vsubps_avx(auVar63,(undefined1  [16])0x0);
        auVar182._0_4_ = auVar48._0_4_ + auVar44._0_4_;
        auVar182._4_4_ = auVar48._4_4_ + auVar44._4_4_;
        auVar182._8_4_ = auVar48._8_4_ + auVar44._8_4_;
        auVar182._12_4_ = auVar48._12_4_ + auVar44._12_4_;
        auVar48 = vshufps_avx(auVar139,auVar139,0xb1);
        auVar44 = vshufps_avx(auVar165,auVar165,0xb1);
        auVar41 = vshufps_avx(auVar59,auVar59,0xb1);
        auVar51 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar230._4_4_ = auVar182._0_4_;
        auVar230._0_4_ = auVar182._0_4_;
        auVar230._8_4_ = auVar182._0_4_;
        auVar230._12_4_ = auVar182._0_4_;
        auVar55 = vshufps_avx(auVar182,auVar182,0x55);
        fVar199 = auVar55._0_4_;
        auVar193._0_4_ = auVar48._0_4_ * fVar199;
        fVar210 = auVar55._4_4_;
        auVar193._4_4_ = auVar48._4_4_ * fVar210;
        fVar212 = auVar55._8_4_;
        auVar193._8_4_ = auVar48._8_4_ * fVar212;
        fVar209 = auVar55._12_4_;
        auVar193._12_4_ = auVar48._12_4_ * fVar209;
        auVar201._0_4_ = auVar44._0_4_ * fVar199;
        auVar201._4_4_ = auVar44._4_4_ * fVar210;
        auVar201._8_4_ = auVar44._8_4_ * fVar212;
        auVar201._12_4_ = auVar44._12_4_ * fVar209;
        auVar217._0_4_ = auVar41._0_4_ * fVar199;
        auVar217._4_4_ = auVar41._4_4_ * fVar210;
        auVar217._8_4_ = auVar41._8_4_ * fVar212;
        auVar217._12_4_ = auVar41._12_4_ * fVar209;
        auVar183._0_4_ = auVar51._0_4_ * fVar199;
        auVar183._4_4_ = auVar51._4_4_ * fVar210;
        auVar183._8_4_ = auVar51._8_4_ * fVar212;
        auVar183._12_4_ = auVar51._12_4_ * fVar209;
        auVar48 = vfmadd231ps_fma(auVar193,auVar230,auVar139);
        auVar44 = vfmadd231ps_fma(auVar201,auVar230,auVar165);
        auVar57 = vfmadd231ps_fma(auVar217,auVar230,auVar59);
        auVar58 = vfmadd231ps_fma(auVar183,(undefined1  [16])0x0,auVar230);
        auVar55 = vshufpd_avx(auVar48,auVar48,1);
        auVar56 = vshufpd_avx(auVar44,auVar44,1);
        auVar87._16_48_ = auVar101._16_48_;
        auVar53 = vshufpd_avx512vl(auVar57,auVar57,1);
        auVar54 = vshufpd_avx512vl(auVar58,auVar58,1);
        auVar41 = vminss_avx(auVar48,auVar44);
        auVar48 = vmaxss_avx(auVar44,auVar48);
        auVar51 = vminss_avx(auVar57,auVar58);
        auVar44 = vmaxss_avx(auVar58,auVar57);
        auVar41 = vminss_avx(auVar41,auVar51);
        auVar48 = vmaxss_avx(auVar44,auVar48);
        auVar51 = vminss_avx(auVar55,auVar56);
        auVar44 = vmaxss_avx(auVar56,auVar55);
        auVar55 = vminss_avx512f(auVar53,auVar54);
        auVar56 = vmaxss_avx512f(auVar54,auVar53);
        auVar44 = vmaxss_avx(auVar56,auVar44);
        auVar87._0_16_ = vminss_avx512f(auVar51,auVar55);
        fVar210 = auVar44._0_4_;
        fVar199 = auVar48._0_4_;
        if (auVar41._0_4_ < 0.0001) {
          bVar39 = fVar210 == -0.0001;
          bVar36 = NAN(fVar210);
          if (fVar210 <= -0.0001) goto LAB_01cd358f;
          break;
        }
LAB_01cd358f:
        vucomiss_avx512f(auVar87._0_16_);
        bVar39 = fVar210 <= -0.0001;
        bVar37 = -0.0001 < fVar199;
        bVar36 = bVar39;
        if (!bVar39) break;
        uVar13 = vcmpps_avx512vl(auVar41,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar14 = vcmpps_avx512vl(auVar87._0_16_,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar29 = (byte)uVar13 & (byte)uVar14 & 1;
        bVar39 = bVar37 && bVar29 == 0;
        bVar36 = bVar37 && bVar29 == 0;
      } while (!bVar37 || bVar29 != 0);
      auVar56 = auVar246._0_16_;
      vcmpss_avx512f(auVar41,auVar56,1);
      uVar13 = vcmpss_avx512f(auVar48,auVar56,1);
      bVar37 = (bool)((byte)uVar13 & 1);
      auVar89._16_48_ = auVar87._16_48_;
      auVar89._0_16_ = auVar247._0_16_;
      auVar88._4_60_ = auVar89._4_60_;
      auVar88._0_4_ = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * auVar247._0_4_);
      vucomiss_avx512f(auVar88._0_16_);
      bVar36 = (bool)(!bVar39 | bVar36);
      bVar37 = bVar36 == false;
      auVar91._16_48_ = auVar87._16_48_;
      auVar91._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar90._4_60_ = auVar91._4_60_;
      auVar90._0_4_ = (uint)bVar36 * auVar246._0_4_ + (uint)!bVar36 * 0x7f800000;
      auVar55 = auVar90._0_16_;
      auVar93._16_48_ = auVar87._16_48_;
      auVar93._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar92._4_60_ = auVar93._4_60_;
      auVar92._0_4_ = (uint)bVar36 * auVar246._0_4_ + (uint)!bVar36 * -0x800000;
      auVar51 = auVar92._0_16_;
      uVar13 = vcmpss_avx512f(auVar87._0_16_,auVar56,1);
      bVar39 = (bool)((byte)uVar13 & 1);
      auVar95._16_48_ = auVar87._16_48_;
      auVar95._0_16_ = auVar247._0_16_;
      auVar94._4_60_ = auVar95._4_60_;
      auVar94._0_4_ = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * auVar247._0_4_);
      vucomiss_avx512f(auVar94._0_16_);
      if ((bVar36) || (bVar37)) {
        auVar57 = vucomiss_avx512f(auVar41);
        if ((bVar36) || (bVar37)) {
          auVar58 = vxorps_avx512vl(auVar41,auVar240._0_16_);
          auVar41 = vsubss_avx512f(auVar57,auVar41);
          auVar41 = vdivss_avx512f(auVar58,auVar41);
          auVar57 = vsubss_avx512f(ZEXT416(0x3f800000),auVar41);
          auVar57 = vfmadd213ss_avx512f(auVar57,auVar56,auVar41);
          auVar41 = auVar57;
        }
        else {
          auVar41 = vxorps_avx512vl(auVar57,auVar57);
          vucomiss_avx512f(auVar41);
          auVar57 = ZEXT416(0x3f800000);
          if ((bVar36) || (bVar37)) {
            auVar57 = SUB6416(ZEXT464(0xff800000),0);
            auVar41 = ZEXT416(0x7f800000);
          }
        }
        auVar55 = vminss_avx512f(auVar55,auVar41);
        auVar51 = vmaxss_avx(auVar57,auVar51);
      }
      auVar247 = ZEXT464(0x3f800000);
      uVar13 = vcmpss_avx512f(auVar44,auVar56,1);
      bVar39 = (bool)((byte)uVar13 & 1);
      auVar44 = auVar247._0_16_;
      fVar212 = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * 0x3f800000);
      if ((auVar88._0_4_ != fVar212) || (NAN(auVar88._0_4_) || NAN(fVar212))) {
        if ((fVar210 != fVar199) || (NAN(fVar210) || NAN(fVar199))) {
          auVar48 = vxorps_avx512vl(auVar48,auVar240._0_16_);
          auVar184._0_4_ = auVar48._0_4_ / (fVar210 - fVar199);
          auVar184._4_12_ = auVar48._4_12_;
          auVar48 = vsubss_avx512f(auVar44,auVar184);
          auVar48 = vfmadd213ss_avx512f(auVar48,auVar56,auVar184);
          auVar41 = auVar48;
        }
        else if ((fVar199 != 0.0) ||
                (auVar48 = auVar44, auVar41 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar199))) {
          auVar48 = SUB6416(ZEXT464(0xff800000),0);
          auVar41 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar55 = vminss_avx(auVar55,auVar41);
        auVar51 = vmaxss_avx(auVar48,auVar51);
      }
      bVar39 = auVar94._0_4_ != fVar212;
      auVar48 = vminss_avx512f(auVar55,auVar44);
      auVar97._16_48_ = auVar87._16_48_;
      auVar97._0_16_ = auVar55;
      auVar96._4_60_ = auVar97._4_60_;
      auVar96._0_4_ = (uint)bVar39 * auVar48._0_4_ + (uint)!bVar39 * auVar55._0_4_;
      auVar48 = vmaxss_avx512f(auVar44,auVar51);
      auVar99._16_48_ = auVar87._16_48_;
      auVar99._0_16_ = auVar51;
      auVar98._4_60_ = auVar99._4_60_;
      auVar98._0_4_ = (uint)bVar39 * auVar48._0_4_ + (uint)!bVar39 * auVar51._0_4_;
      auVar48 = vmaxss_avx512f(auVar56,auVar96._0_16_);
      auVar87._0_16_ = vminss_avx512f(auVar98._0_16_,auVar44);
    } while (auVar87._0_4_ < auVar48._0_4_);
    auVar57 = vmaxss_avx512f(auVar56,ZEXT416((uint)(auVar48._0_4_ + -0.1)));
    auVar58 = vminss_avx512f(ZEXT416((uint)(auVar87._0_4_ + 0.1)),auVar44);
    auVar126._0_8_ = auVar139._0_8_;
    auVar126._8_8_ = auVar126._0_8_;
    auVar202._8_8_ = auVar165._0_8_;
    auVar202._0_8_ = auVar165._0_8_;
    auVar218._8_8_ = auVar59._0_8_;
    auVar218._0_8_ = auVar59._0_8_;
    auVar48 = vshufpd_avx(auVar165,auVar165,3);
    auVar41 = vshufpd_avx(auVar59,auVar59,3);
    auVar51 = vshufps_avx(auVar57,auVar58,0);
    auVar56 = vsubps_avx512vl(auVar52,auVar51);
    fVar199 = auVar51._0_4_;
    auVar153._0_4_ = fVar199 * auVar60._0_4_;
    fVar210 = auVar51._4_4_;
    auVar153._4_4_ = fVar210 * auVar60._4_4_;
    fVar212 = auVar51._8_4_;
    auVar153._8_4_ = fVar212 * auVar60._8_4_;
    fVar209 = auVar51._12_4_;
    auVar153._12_4_ = fVar209 * auVar60._12_4_;
    auVar166._0_4_ = fVar199 * auVar48._0_4_;
    auVar166._4_4_ = fVar210 * auVar48._4_4_;
    auVar166._8_4_ = fVar212 * auVar48._8_4_;
    auVar166._12_4_ = fVar209 * auVar48._12_4_;
    auVar233._0_4_ = auVar41._0_4_ * fVar199;
    auVar233._4_4_ = auVar41._4_4_ * fVar210;
    auVar233._8_4_ = auVar41._8_4_ * fVar212;
    auVar233._12_4_ = auVar41._12_4_ * fVar209;
    auVar143._0_4_ = fVar199 * auVar63._0_4_;
    auVar143._4_4_ = fVar210 * auVar63._4_4_;
    auVar143._8_4_ = fVar212 * auVar63._8_4_;
    auVar143._12_4_ = fVar209 * auVar63._12_4_;
    auVar60 = vfmadd231ps_fma(auVar153,auVar56,auVar126);
    auVar63 = vfmadd231ps_fma(auVar166,auVar56,auVar202);
    auVar55 = vfmadd231ps_fma(auVar233,auVar56,auVar218);
    auVar56 = vfmadd231ps_fma(auVar143,auVar56,ZEXT816(0));
    auVar41 = vsubss_avx512f(auVar44,auVar57);
    auVar48 = vmovshdup_avx(auVar42);
    auVar139 = vfmadd231ss_fma(ZEXT416((uint)(auVar48._0_4_ * auVar57._0_4_)),auVar42,auVar41);
    auVar41 = vsubss_avx512f(auVar44,auVar58);
    auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar48._0_4_ * auVar58._0_4_)),auVar42,auVar41);
    auVar59 = vdivss_avx512f(auVar44,ZEXT416((uint)fVar103));
    auVar48 = vsubps_avx(auVar63,auVar60);
    auVar57 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar41 = vmulps_avx512vl(auVar48,auVar57);
    auVar48 = vsubps_avx(auVar55,auVar63);
    auVar51 = vmulps_avx512vl(auVar48,auVar57);
    auVar48 = vsubps_avx(auVar56,auVar55);
    auVar48 = vmulps_avx512vl(auVar48,auVar57);
    auVar42 = vminps_avx(auVar51,auVar48);
    auVar48 = vmaxps_avx(auVar51,auVar48);
    auVar42 = vminps_avx(auVar41,auVar42);
    auVar48 = vmaxps_avx(auVar41,auVar48);
    auVar41 = vshufpd_avx(auVar42,auVar42,3);
    auVar51 = vshufpd_avx(auVar48,auVar48,3);
    auVar42 = vminps_avx(auVar42,auVar41);
    auVar48 = vmaxps_avx(auVar48,auVar51);
    fVar103 = auVar59._0_4_;
    auVar185._0_4_ = auVar42._0_4_ * fVar103;
    auVar185._4_4_ = auVar42._4_4_ * fVar103;
    auVar185._8_4_ = auVar42._8_4_ * fVar103;
    auVar185._12_4_ = auVar42._12_4_ * fVar103;
    auVar173._0_4_ = fVar103 * auVar48._0_4_;
    auVar173._4_4_ = fVar103 * auVar48._4_4_;
    auVar173._8_4_ = fVar103 * auVar48._8_4_;
    auVar173._12_4_ = fVar103 * auVar48._12_4_;
    auVar59 = vdivss_avx512f(auVar44,ZEXT416((uint)(auVar53._0_4_ - auVar139._0_4_)));
    auVar48 = vshufpd_avx(auVar60,auVar60,3);
    auVar42 = vshufpd_avx(auVar63,auVar63,3);
    auVar41 = vshufpd_avx(auVar55,auVar55,3);
    auVar51 = vshufpd_avx(auVar56,auVar56,3);
    auVar48 = vsubps_avx(auVar48,auVar60);
    auVar60 = vsubps_avx(auVar42,auVar63);
    auVar63 = vsubps_avx(auVar41,auVar55);
    auVar51 = vsubps_avx(auVar51,auVar56);
    auVar42 = vminps_avx(auVar48,auVar60);
    auVar48 = vmaxps_avx(auVar48,auVar60);
    auVar41 = vminps_avx(auVar63,auVar51);
    auVar41 = vminps_avx(auVar42,auVar41);
    auVar42 = vmaxps_avx(auVar63,auVar51);
    auVar48 = vmaxps_avx(auVar48,auVar42);
    fVar103 = auVar59._0_4_;
    auVar219._0_4_ = fVar103 * auVar41._0_4_;
    auVar219._4_4_ = fVar103 * auVar41._4_4_;
    auVar219._8_4_ = fVar103 * auVar41._8_4_;
    auVar219._12_4_ = fVar103 * auVar41._12_4_;
    auVar203._0_4_ = fVar103 * auVar48._0_4_;
    auVar203._4_4_ = fVar103 * auVar48._4_4_;
    auVar203._8_4_ = fVar103 * auVar48._8_4_;
    auVar203._12_4_ = fVar103 * auVar48._12_4_;
    auVar51 = vinsertps_avx(auVar40,auVar139,0x10);
    auVar54 = vpermt2ps_avx512vl(auVar40,_DAT_01feecd0,auVar53);
    auVar114._0_4_ = auVar51._0_4_ + auVar54._0_4_;
    auVar114._4_4_ = auVar51._4_4_ + auVar54._4_4_;
    auVar114._8_4_ = auVar51._8_4_ + auVar54._8_4_;
    auVar114._12_4_ = auVar51._12_4_ + auVar54._12_4_;
    auVar59 = vmulps_avx512vl(auVar114,auVar108._0_16_);
    auVar42 = vshufps_avx(auVar59,auVar59,0x54);
    uVar112 = auVar59._0_4_;
    auVar117._4_4_ = uVar112;
    auVar117._0_4_ = uVar112;
    auVar117._8_4_ = uVar112;
    auVar117._12_4_ = uVar112;
    auVar41 = vfmadd213ps_fma(auVar86._0_16_,auVar117,auVar4);
    auVar60 = vfmadd213ps_fma(local_450,auVar117,auVar47);
    auVar63 = vfmadd213ps_fma(local_460,auVar117,auVar5);
    auVar48 = vsubps_avx(auVar60,auVar41);
    auVar41 = vfmadd213ps_fma(auVar48,auVar117,auVar41);
    auVar48 = vsubps_avx(auVar63,auVar60);
    auVar48 = vfmadd213ps_fma(auVar48,auVar117,auVar60);
    auVar48 = vsubps_avx(auVar48,auVar41);
    auVar41 = vfmadd231ps_fma(auVar41,auVar48,auVar117);
    auVar55 = vmulps_avx512vl(auVar48,auVar57);
    auVar226._8_8_ = auVar41._0_8_;
    auVar226._0_8_ = auVar41._0_8_;
    auVar48 = vshufpd_avx(auVar41,auVar41,3);
    auVar41 = vshufps_avx(auVar59,auVar59,0x55);
    auVar60 = vsubps_avx(auVar48,auVar226);
    auVar63 = vfmadd231ps_fma(auVar226,auVar41,auVar60);
    auVar234._8_8_ = auVar55._0_8_;
    auVar234._0_8_ = auVar55._0_8_;
    auVar48 = vshufpd_avx(auVar55,auVar55,3);
    auVar48 = vsubps_avx512vl(auVar48,auVar234);
    auVar48 = vfmadd213ps_avx512vl(auVar48,auVar41,auVar234);
    auVar118._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
    auVar118._8_4_ = auVar60._8_4_ ^ 0x80000000;
    auVar118._12_4_ = auVar60._12_4_ ^ 0x80000000;
    auVar41 = vmovshdup_avx512vl(auVar48);
    auVar235._0_8_ = auVar41._0_8_ ^ 0x8000000080000000;
    auVar235._8_4_ = auVar41._8_4_ ^ 0x80000000;
    auVar235._12_4_ = auVar41._12_4_ ^ 0x80000000;
    auVar55 = vmovshdup_avx512vl(auVar60);
    auVar56 = vpermt2ps_avx512vl(auVar235,ZEXT416(5),auVar60);
    auVar41 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar41._0_4_ * auVar60._0_4_)),auVar48,auVar55);
    auVar60 = vpermt2ps_avx512vl(auVar48,SUB6416(ZEXT464(4),0),auVar118);
    auVar144._0_4_ = auVar41._0_4_;
    auVar144._4_4_ = auVar144._0_4_;
    auVar144._8_4_ = auVar144._0_4_;
    auVar144._12_4_ = auVar144._0_4_;
    auVar48 = vdivps_avx(auVar56,auVar144);
    auVar61 = vdivps_avx512vl(auVar60,auVar144);
    fVar103 = auVar63._0_4_;
    auVar41 = vshufps_avx(auVar63,auVar63,0x55);
    auVar227._0_4_ = fVar103 * auVar48._0_4_ + auVar41._0_4_ * auVar61._0_4_;
    auVar227._4_4_ = fVar103 * auVar48._4_4_ + auVar41._4_4_ * auVar61._4_4_;
    auVar227._8_4_ = fVar103 * auVar48._8_4_ + auVar41._8_4_ * auVar61._8_4_;
    auVar227._12_4_ = fVar103 * auVar48._12_4_ + auVar41._12_4_ * auVar61._12_4_;
    auVar57 = vsubps_avx(auVar42,auVar227);
    auVar41 = vmovshdup_avx(auVar48);
    auVar42 = vinsertps_avx(auVar185,auVar219,0x1c);
    auVar236._0_4_ = auVar41._0_4_ * auVar42._0_4_;
    auVar236._4_4_ = auVar41._4_4_ * auVar42._4_4_;
    auVar236._8_4_ = auVar41._8_4_ * auVar42._8_4_;
    auVar236._12_4_ = auVar41._12_4_ * auVar42._12_4_;
    auVar58 = vinsertps_avx512f(auVar173,auVar203,0x1c);
    auVar41 = vmulps_avx512vl(auVar41,auVar58);
    auVar56 = vminps_avx512vl(auVar236,auVar41);
    auVar63 = vmaxps_avx(auVar41,auVar236);
    auVar55 = vmovshdup_avx(auVar61);
    auVar41 = vinsertps_avx(auVar219,auVar185,0x4c);
    auVar220._0_4_ = auVar55._0_4_ * auVar41._0_4_;
    auVar220._4_4_ = auVar55._4_4_ * auVar41._4_4_;
    auVar220._8_4_ = auVar55._8_4_ * auVar41._8_4_;
    auVar220._12_4_ = auVar55._12_4_ * auVar41._12_4_;
    auVar60 = vinsertps_avx(auVar203,auVar173,0x4c);
    auVar204._0_4_ = auVar55._0_4_ * auVar60._0_4_;
    auVar204._4_4_ = auVar55._4_4_ * auVar60._4_4_;
    auVar204._8_4_ = auVar55._8_4_ * auVar60._8_4_;
    auVar204._12_4_ = auVar55._12_4_ * auVar60._12_4_;
    auVar55 = vminps_avx(auVar220,auVar204);
    auVar56 = vaddps_avx512vl(auVar56,auVar55);
    auVar55 = vmaxps_avx(auVar204,auVar220);
    auVar205._0_4_ = auVar63._0_4_ + auVar55._0_4_;
    auVar205._4_4_ = auVar63._4_4_ + auVar55._4_4_;
    auVar205._8_4_ = auVar63._8_4_ + auVar55._8_4_;
    auVar205._12_4_ = auVar63._12_4_ + auVar55._12_4_;
    auVar221._8_8_ = 0x3f80000000000000;
    auVar221._0_8_ = 0x3f80000000000000;
    auVar63 = vsubps_avx(auVar221,auVar205);
    auVar55 = vsubps_avx(auVar221,auVar56);
    auVar56 = vsubps_avx(auVar51,auVar59);
    auVar59 = vsubps_avx(auVar54,auVar59);
    fVar209 = auVar56._0_4_;
    auVar237._0_4_ = fVar209 * auVar63._0_4_;
    fVar211 = auVar56._4_4_;
    auVar237._4_4_ = fVar211 * auVar63._4_4_;
    fVar213 = auVar56._8_4_;
    auVar237._8_4_ = fVar213 * auVar63._8_4_;
    fVar214 = auVar56._12_4_;
    auVar237._12_4_ = fVar214 * auVar63._12_4_;
    auVar62 = vbroadcastss_avx512vl(auVar48);
    auVar42 = vmulps_avx512vl(auVar62,auVar42);
    auVar58 = vmulps_avx512vl(auVar62,auVar58);
    auVar62 = vminps_avx512vl(auVar42,auVar58);
    auVar58 = vmaxps_avx512vl(auVar58,auVar42);
    auVar42 = vbroadcastss_avx512vl(auVar61);
    auVar41 = vmulps_avx512vl(auVar42,auVar41);
    auVar42 = vmulps_avx512vl(auVar42,auVar60);
    auVar60 = vminps_avx512vl(auVar41,auVar42);
    auVar60 = vaddps_avx512vl(auVar62,auVar60);
    auVar56 = vmulps_avx512vl(auVar56,auVar55);
    fVar103 = auVar59._0_4_;
    auVar206._0_4_ = fVar103 * auVar63._0_4_;
    fVar199 = auVar59._4_4_;
    auVar206._4_4_ = fVar199 * auVar63._4_4_;
    fVar210 = auVar59._8_4_;
    auVar206._8_4_ = fVar210 * auVar63._8_4_;
    fVar212 = auVar59._12_4_;
    auVar206._12_4_ = fVar212 * auVar63._12_4_;
    auVar222._0_4_ = fVar103 * auVar55._0_4_;
    auVar222._4_4_ = fVar199 * auVar55._4_4_;
    auVar222._8_4_ = fVar210 * auVar55._8_4_;
    auVar222._12_4_ = fVar212 * auVar55._12_4_;
    auVar42 = vmaxps_avx(auVar42,auVar41);
    auVar174._0_4_ = auVar58._0_4_ + auVar42._0_4_;
    auVar174._4_4_ = auVar58._4_4_ + auVar42._4_4_;
    auVar174._8_4_ = auVar58._8_4_ + auVar42._8_4_;
    auVar174._12_4_ = auVar58._12_4_ + auVar42._12_4_;
    auVar186._8_8_ = 0x3f800000;
    auVar186._0_8_ = 0x3f800000;
    auVar42 = vsubps_avx(auVar186,auVar174);
    auVar41 = vsubps_avx512vl(auVar186,auVar60);
    auVar231._0_4_ = fVar209 * auVar42._0_4_;
    auVar231._4_4_ = fVar211 * auVar42._4_4_;
    auVar231._8_4_ = fVar213 * auVar42._8_4_;
    auVar231._12_4_ = fVar214 * auVar42._12_4_;
    auVar228._0_4_ = fVar209 * auVar41._0_4_;
    auVar228._4_4_ = fVar211 * auVar41._4_4_;
    auVar228._8_4_ = fVar213 * auVar41._8_4_;
    auVar228._12_4_ = fVar214 * auVar41._12_4_;
    auVar175._0_4_ = fVar103 * auVar42._0_4_;
    auVar175._4_4_ = fVar199 * auVar42._4_4_;
    auVar175._8_4_ = fVar210 * auVar42._8_4_;
    auVar175._12_4_ = fVar212 * auVar42._12_4_;
    auVar187._0_4_ = fVar103 * auVar41._0_4_;
    auVar187._4_4_ = fVar199 * auVar41._4_4_;
    auVar187._8_4_ = fVar210 * auVar41._8_4_;
    auVar187._12_4_ = fVar212 * auVar41._12_4_;
    auVar42 = vminps_avx(auVar231,auVar228);
    auVar41 = vminps_avx512vl(auVar175,auVar187);
    auVar60 = vminps_avx512vl(auVar42,auVar41);
    auVar42 = vmaxps_avx(auVar228,auVar231);
    auVar41 = vmaxps_avx(auVar187,auVar175);
    auVar41 = vmaxps_avx(auVar41,auVar42);
    auVar63 = vminps_avx512vl(auVar237,auVar56);
    auVar42 = vminps_avx(auVar206,auVar222);
    auVar42 = vminps_avx(auVar63,auVar42);
    auVar42 = vhaddps_avx(auVar60,auVar42);
    auVar63 = vmaxps_avx512vl(auVar56,auVar237);
    auVar60 = vmaxps_avx(auVar222,auVar206);
    auVar60 = vmaxps_avx(auVar60,auVar63);
    auVar41 = vhaddps_avx(auVar41,auVar60);
    auVar42 = vshufps_avx(auVar42,auVar42,0xe8);
    auVar41 = vshufps_avx(auVar41,auVar41,0xe8);
    auVar176._0_4_ = auVar42._0_4_ + auVar57._0_4_;
    auVar176._4_4_ = auVar42._4_4_ + auVar57._4_4_;
    auVar176._8_4_ = auVar42._8_4_ + auVar57._8_4_;
    auVar176._12_4_ = auVar42._12_4_ + auVar57._12_4_;
    auVar188._0_4_ = auVar41._0_4_ + auVar57._0_4_;
    auVar188._4_4_ = auVar41._4_4_ + auVar57._4_4_;
    auVar188._8_4_ = auVar41._8_4_ + auVar57._8_4_;
    auVar188._12_4_ = auVar41._12_4_ + auVar57._12_4_;
    auVar42 = vmaxps_avx(auVar51,auVar176);
    auVar41 = vminps_avx(auVar188,auVar54);
    uVar33 = vcmpps_avx512vl(auVar41,auVar42,1);
    auVar42 = ZEXT416(5);
    if ((uVar33 & 3) != 0) {
      auVar87._0_16_ = vxorps_avx512vl(ZEXT416(5),auVar42);
      auVar246 = ZEXT1664(auVar87._0_16_);
      goto LAB_01cd3363;
    }
    uVar33 = vcmpps_avx512vl(auVar188,auVar54,1);
    uVar13 = vcmpps_avx512vl(auVar40,auVar176,1);
    if (((ushort)uVar13 & (ushort)uVar33 & 1) == 0) {
      bVar29 = 0;
    }
    else {
      auVar41 = vmovshdup_avx(auVar176);
      bVar29 = auVar139._0_4_ < auVar41._0_4_ & (byte)(uVar33 >> 1) & 0x7f;
    }
    auVar100._0_16_ = vxorps_avx512vl(auVar42,auVar42);
    auVar100._16_48_ = auVar87._16_48_;
    auVar246 = ZEXT1664(auVar100._0_16_);
    local_610 = auVar46._0_4_;
    fStack_60c = auVar46._4_4_;
    fStack_608 = auVar46._8_4_;
    fStack_604 = auVar46._12_4_;
    if (((3 < (uint)uVar25 || uVar8 != 0 && !bVar38) | bVar29) == 1) {
      lVar28 = 200;
      auVar87 = auVar100;
      do {
        auVar40 = vsubss_avx512f(auVar44,auVar57);
        fVar210 = auVar40._0_4_;
        fVar103 = fVar210 * fVar210 * fVar210;
        fVar212 = auVar57._0_4_;
        fVar199 = fVar212 * 3.0 * fVar210 * fVar210;
        fVar210 = fVar210 * fVar212 * fVar212 * 3.0;
        auVar132._4_4_ = fVar103;
        auVar132._0_4_ = fVar103;
        auVar132._8_4_ = fVar103;
        auVar132._12_4_ = fVar103;
        auVar127._4_4_ = fVar199;
        auVar127._0_4_ = fVar199;
        auVar127._8_4_ = fVar199;
        auVar127._12_4_ = fVar199;
        auVar105._4_4_ = fVar210;
        auVar105._0_4_ = fVar210;
        auVar105._8_4_ = fVar210;
        auVar105._12_4_ = fVar210;
        fVar212 = fVar212 * fVar212 * fVar212;
        auVar154._0_4_ = local_610 * fVar212;
        auVar154._4_4_ = fStack_60c * fVar212;
        auVar154._8_4_ = fStack_608 * fVar212;
        auVar154._12_4_ = fStack_604 * fVar212;
        auVar40 = vfmadd231ps_fma(auVar154,auVar5,auVar105);
        auVar40 = vfmadd231ps_fma(auVar40,auVar47,auVar127);
        auVar40 = vfmadd231ps_fma(auVar40,auVar4,auVar132);
        auVar106._8_8_ = auVar40._0_8_;
        auVar106._0_8_ = auVar40._0_8_;
        auVar40 = vshufpd_avx(auVar40,auVar40,3);
        auVar42 = vshufps_avx(auVar57,auVar57,0x55);
        auVar40 = vsubps_avx(auVar40,auVar106);
        auVar42 = vfmadd213ps_fma(auVar40,auVar42,auVar106);
        fVar103 = auVar42._0_4_;
        auVar40 = vshufps_avx(auVar42,auVar42,0x55);
        auVar107._0_4_ = auVar48._0_4_ * fVar103 + auVar61._0_4_ * auVar40._0_4_;
        auVar107._4_4_ = auVar48._4_4_ * fVar103 + auVar61._4_4_ * auVar40._4_4_;
        auVar107._8_4_ = auVar48._8_4_ * fVar103 + auVar61._8_4_ * auVar40._8_4_;
        auVar107._12_4_ = auVar48._12_4_ * fVar103 + auVar61._12_4_ * auVar40._12_4_;
        auVar57 = vsubps_avx(auVar57,auVar107);
        auVar40 = vandps_avx512vl(auVar42,auVar239._0_16_);
        auVar87._0_16_ = vprolq_avx512vl(auVar40,0x20);
        auVar40 = vmaxss_avx(auVar87._0_16_,auVar40);
        bVar38 = auVar40._0_4_ <= fVar124;
        if (auVar40._0_4_ < fVar124) {
          auVar40 = vucomiss_avx512f(auVar100._0_16_);
          if (bVar38) {
            auVar48 = vucomiss_avx512f(auVar40);
            auVar247 = ZEXT1664(auVar48);
            if (bVar38) {
              vmovshdup_avx(auVar40);
              auVar48 = vucomiss_avx512f(auVar100._0_16_);
              if (bVar38) {
                auVar42 = vucomiss_avx512f(auVar48);
                auVar247 = ZEXT1664(auVar42);
                if (bVar38) {
                  auVar44 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar59 = vinsertps_avx(auVar44,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar44 = vdpps_avx(auVar59,local_470,0x7f);
                  auVar41 = vdpps_avx(auVar59,local_480,0x7f);
                  auVar51 = vdpps_avx(auVar59,local_490,0x7f);
                  auVar60 = vdpps_avx(auVar59,local_4a0,0x7f);
                  auVar63 = vdpps_avx(auVar59,local_4b0,0x7f);
                  auVar55 = vdpps_avx(auVar59,local_4c0,0x7f);
                  auVar56 = vdpps_avx(auVar59,local_4d0,0x7f);
                  auVar59 = vdpps_avx(auVar59,local_4e0,0x7f);
                  auVar57 = vsubss_avx512f(auVar42,auVar48);
                  fVar103 = auVar48._0_4_;
                  auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar103 * auVar63._0_4_)),auVar57,auVar44
                                           );
                  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * fVar103)),auVar57,auVar41
                                           );
                  auVar41 = vfmadd231ss_fma(ZEXT416((uint)(auVar56._0_4_ * fVar103)),auVar57,auVar51
                                           );
                  auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar103 * auVar59._0_4_)),auVar57,auVar60
                                           );
                  auVar87._0_16_ = vsubss_avx512f(auVar42,auVar40);
                  auVar155._0_4_ = auVar87._0_4_;
                  fVar103 = auVar155._0_4_ * auVar155._0_4_ * auVar155._0_4_;
                  fVar212 = auVar40._0_4_;
                  fVar199 = fVar212 * 3.0 * auVar155._0_4_ * auVar155._0_4_;
                  fVar210 = auVar155._0_4_ * fVar212 * fVar212 * 3.0;
                  fVar209 = fVar212 * fVar212 * fVar212;
                  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar51._0_4_)),
                                            ZEXT416((uint)fVar210),auVar41);
                  auVar42 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar199),auVar44);
                  vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar103),auVar48);
                  auVar48 = vucomiss_avx512f(ZEXT416(uVar1));
                  if (bVar38) {
                    fVar211 = *(float *)(ray + k * 4 + 0x200);
                    if (auVar48._0_4_ <= fVar211) {
                      auVar42 = vshufps_avx(auVar40,auVar40,0x55);
                      auVar41 = vsubps_avx512vl(auVar52,auVar42);
                      fVar213 = auVar42._0_4_;
                      auVar189._0_4_ = fVar213 * (float)local_500._0_4_;
                      fVar214 = auVar42._4_4_;
                      auVar189._4_4_ = fVar214 * (float)local_500._4_4_;
                      fVar223 = auVar42._8_4_;
                      auVar189._8_4_ = fVar223 * fStack_4f8;
                      fVar224 = auVar42._12_4_;
                      auVar189._12_4_ = fVar224 * fStack_4f4;
                      auVar194._0_4_ = fVar213 * (float)local_550._0_4_;
                      auVar194._4_4_ = fVar214 * (float)local_550._4_4_;
                      auVar194._8_4_ = fVar223 * fStack_548;
                      auVar194._12_4_ = fVar224 * fStack_544;
                      auVar207._0_4_ = fVar213 * (float)local_560._0_4_;
                      auVar207._4_4_ = fVar214 * (float)local_560._4_4_;
                      auVar207._8_4_ = fVar223 * fStack_558;
                      auVar207._12_4_ = fVar224 * fStack_554;
                      auVar167._0_4_ = fVar213 * (float)local_520._0_4_;
                      auVar167._4_4_ = fVar214 * (float)local_520._4_4_;
                      auVar167._8_4_ = fVar223 * fStack_518;
                      auVar167._12_4_ = fVar224 * fStack_514;
                      auVar42 = vfmadd231ps_fma(auVar189,auVar41,local_4f0);
                      auVar52 = vfmadd231ps_fma(auVar194,auVar41,local_530);
                      auVar44 = vfmadd231ps_fma(auVar207,auVar41,local_540);
                      auVar41 = vfmadd231ps_fma(auVar167,auVar41,local_510);
                      auVar42 = vsubps_avx(auVar52,auVar42);
                      auVar52 = vsubps_avx(auVar44,auVar52);
                      auVar44 = vsubps_avx(auVar41,auVar44);
                      auVar208._0_4_ = fVar212 * auVar52._0_4_;
                      auVar208._4_4_ = fVar212 * auVar52._4_4_;
                      auVar208._8_4_ = fVar212 * auVar52._8_4_;
                      auVar208._12_4_ = fVar212 * auVar52._12_4_;
                      auVar155._4_4_ = auVar155._0_4_;
                      auVar155._8_4_ = auVar155._0_4_;
                      auVar155._12_4_ = auVar155._0_4_;
                      auVar42 = vfmadd231ps_fma(auVar208,auVar155,auVar42);
                      auVar168._0_4_ = fVar212 * auVar44._0_4_;
                      auVar168._4_4_ = fVar212 * auVar44._4_4_;
                      auVar168._8_4_ = fVar212 * auVar44._8_4_;
                      auVar168._12_4_ = fVar212 * auVar44._12_4_;
                      auVar52 = vfmadd231ps_fma(auVar168,auVar155,auVar52);
                      auVar169._0_4_ = fVar212 * auVar52._0_4_;
                      auVar169._4_4_ = fVar212 * auVar52._4_4_;
                      auVar169._8_4_ = fVar212 * auVar52._8_4_;
                      auVar169._12_4_ = fVar212 * auVar52._12_4_;
                      auVar42 = vfmadd231ps_fma(auVar169,auVar155,auVar42);
                      auVar17._8_4_ = 0x40400000;
                      auVar17._0_8_ = 0x4040000040400000;
                      auVar17._12_4_ = 0x40400000;
                      auVar87._0_16_ = vmulps_avx512vl(auVar42,auVar17);
                      pGVar9 = (context->scene->geometries).items[uVar34].ptr;
                      if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                        bVar29 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar29 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        local_5c0 = auVar69;
                        auVar145._0_4_ = fVar209 * (float)local_5a0._0_4_;
                        auVar145._4_4_ = fVar209 * (float)local_5a0._4_4_;
                        auVar145._8_4_ = fVar209 * fStack_598;
                        auVar145._12_4_ = fVar209 * fStack_594;
                        auVar133._4_4_ = fVar210;
                        auVar133._0_4_ = fVar210;
                        auVar133._8_4_ = fVar210;
                        auVar133._12_4_ = fVar210;
                        auVar42 = vfmadd132ps_fma(auVar133,auVar145,local_590);
                        auVar128._4_4_ = fVar199;
                        auVar128._0_4_ = fVar199;
                        auVar128._8_4_ = fVar199;
                        auVar128._12_4_ = fVar199;
                        auVar42 = vfmadd132ps_fma(auVar128,auVar42,local_580);
                        auVar119._4_4_ = fVar103;
                        auVar119._0_4_ = fVar103;
                        auVar119._8_4_ = fVar103;
                        auVar119._12_4_ = fVar103;
                        auVar44 = vfmadd132ps_fma(auVar119,auVar42,local_570);
                        auVar42 = vshufps_avx(auVar44,auVar44,0xc9);
                        auVar52 = vshufps_avx(auVar87._0_16_,auVar87._0_16_,0xc9);
                        auVar120._0_4_ = auVar44._0_4_ * auVar52._0_4_;
                        auVar120._4_4_ = auVar44._4_4_ * auVar52._4_4_;
                        auVar120._8_4_ = auVar44._8_4_ * auVar52._8_4_;
                        auVar120._12_4_ = auVar44._12_4_ * auVar52._12_4_;
                        auVar42 = vfmsub231ps_fma(auVar120,auVar87._0_16_,auVar42);
                        local_200 = vbroadcastss_avx512f(auVar40);
                        auVar108 = vbroadcastss_avx512f(ZEXT416(1));
                        local_1c0 = vpermps_avx512f(auVar108,ZEXT1664(auVar40));
                        auVar108 = vpermps_avx512f(auVar108,ZEXT1664(auVar42));
                        auVar239 = vbroadcastss_avx512f(ZEXT416(2));
                        local_280 = vpermps_avx512f(auVar239,ZEXT1664(auVar42));
                        local_240 = vbroadcastss_avx512f(auVar42);
                        local_2c0[0] = (RTCHitN)auVar108[0];
                        local_2c0[1] = (RTCHitN)auVar108[1];
                        local_2c0[2] = (RTCHitN)auVar108[2];
                        local_2c0[3] = (RTCHitN)auVar108[3];
                        local_2c0[4] = (RTCHitN)auVar108[4];
                        local_2c0[5] = (RTCHitN)auVar108[5];
                        local_2c0[6] = (RTCHitN)auVar108[6];
                        local_2c0[7] = (RTCHitN)auVar108[7];
                        local_2c0[8] = (RTCHitN)auVar108[8];
                        local_2c0[9] = (RTCHitN)auVar108[9];
                        local_2c0[10] = (RTCHitN)auVar108[10];
                        local_2c0[0xb] = (RTCHitN)auVar108[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar108[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar108[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar108[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar108[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar108[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar108[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar108[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar108[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar108[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar108[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar108[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar108[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar108[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar108[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar108[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar108[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar108[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar108[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar108[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar108[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar108[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar108[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar108[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar108[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar108[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar108[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar108[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar108[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar108[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar108[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar108[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar108[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar108[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar108[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar108[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar108[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar108[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar108[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar108[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar108[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar108[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar108[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar108[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar108[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar108[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar108[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar108[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar108[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar108[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar108[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar108[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar108[0x3f];
                        local_180 = local_300._0_8_;
                        uStack_178 = local_300._8_8_;
                        uStack_170 = local_300._16_8_;
                        uStack_168 = local_300._24_8_;
                        uStack_160 = local_300._32_8_;
                        uStack_158 = local_300._40_8_;
                        uStack_150 = local_300._48_8_;
                        uStack_148 = local_300._56_8_;
                        auVar108 = vmovdqa64_avx512f(local_340);
                        local_140 = vmovdqa64_avx512f(auVar108);
                        vpcmpeqd_avx2(auVar108._0_32_,auVar108._0_32_);
                        local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = auVar48._0_4_;
                        auVar101 = vmovdqa64_avx512f(local_380);
                        local_400 = vmovdqa64_avx512f(auVar101);
                        local_5f0.valid = (int *)local_400;
                        local_5f0.geometryUserPtr = pGVar9->userPtr;
                        local_5f0.context = context->user;
                        local_5f0.ray = (RTCRayN *)ray;
                        local_5f0.hit = local_2c0;
                        local_5f0.N = 0x10;
                        if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar9->occlusionFilterN)(&local_5f0);
                          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar243 = ZEXT1664(auVar40);
                          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                          auVar240 = ZEXT1664(auVar40);
                          auVar101 = vmovdqa64_avx512f(local_400);
                        }
                        uVar13 = vptestmd_avx512f(auVar101,auVar101);
                        auVar247._32_32_ = auVar101._32_32_;
                        if ((short)uVar13 == 0) {
                          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                          auVar108 = ZEXT1664(auVar40);
                          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar239 = ZEXT1664(auVar40);
                          auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar241 = ZEXT3264(auVar69);
                          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar242 = ZEXT1664(auVar40);
                          auVar244 = ZEXT3264(_DAT_01feed20);
                          auVar40 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
                          auVar246 = ZEXT1664(auVar40);
                          auVar247._0_32_ = local_5c0;
                          auVar245 = ZEXT3264(local_5c0);
                          auVar87._16_48_ = auVar247._16_48_;
                          auVar87._0_16_ = auVar86._0_16_;
                        }
                        else {
                          p_Var10 = context->args->filter;
                          if (p_Var10 == (RTCFilterFunctionN)0x0) {
                            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                            auVar108 = ZEXT1664(auVar40);
                            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar239 = ZEXT1664(auVar40);
                            auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar241 = ZEXT3264(auVar69);
                            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar242 = ZEXT1664(auVar40);
                            auVar244 = ZEXT3264(_DAT_01feed20);
                            auVar40 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
                            auVar246 = ZEXT1664(auVar40);
                            auVar245 = ZEXT3264(local_5c0);
                          }
                          else {
                            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                            auVar108 = ZEXT1664(auVar40);
                            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar239 = ZEXT1664(auVar40);
                            auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar241 = ZEXT3264(auVar69);
                            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar242 = ZEXT1664(auVar40);
                            auVar244 = ZEXT3264(_DAT_01feed20);
                            auVar40 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
                            auVar246 = ZEXT1664(auVar40);
                            auVar245 = ZEXT3264(local_5c0);
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var10)(&local_5f0);
                              auVar245 = ZEXT3264(local_5c0);
                              auVar40 = vxorps_avx512vl(auVar40,auVar40);
                              auVar246 = ZEXT1664(auVar40);
                              auVar244 = ZEXT3264(_DAT_01feed20);
                              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar243 = ZEXT1664(auVar40);
                              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                              auVar242 = ZEXT1664(auVar40);
                              auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar241 = ZEXT3264(auVar69);
                              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar240 = ZEXT1664(auVar40);
                              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar239 = ZEXT1664(auVar40);
                              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                              auVar108 = ZEXT1664(auVar40);
                              auVar101 = vmovdqa64_avx512f(local_400);
                            }
                          }
                          auVar247 = ZEXT464(0x3f800000);
                          uVar33 = vptestmd_avx512f(auVar101,auVar101);
                          auVar101 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar38 = (bool)((byte)uVar33 & 1);
                          auVar87._0_4_ =
                               (uint)bVar38 * auVar101._0_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x200);
                          bVar38 = (bool)((byte)(uVar33 >> 1) & 1);
                          auVar87._4_4_ =
                               (uint)bVar38 * auVar101._4_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x204);
                          bVar38 = (bool)((byte)(uVar33 >> 2) & 1);
                          auVar87._8_4_ =
                               (uint)bVar38 * auVar101._8_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x208);
                          bVar38 = (bool)((byte)(uVar33 >> 3) & 1);
                          auVar87._12_4_ =
                               (uint)bVar38 * auVar101._12_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x20c);
                          bVar38 = (bool)((byte)(uVar33 >> 4) & 1);
                          auVar87._16_4_ =
                               (uint)bVar38 * auVar101._16_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x210);
                          bVar38 = (bool)((byte)(uVar33 >> 5) & 1);
                          auVar87._20_4_ =
                               (uint)bVar38 * auVar101._20_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x214);
                          bVar38 = (bool)((byte)(uVar33 >> 6) & 1);
                          auVar87._24_4_ =
                               (uint)bVar38 * auVar101._24_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x218);
                          bVar38 = (bool)((byte)(uVar33 >> 7) & 1);
                          auVar87._28_4_ =
                               (uint)bVar38 * auVar101._28_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x21c);
                          bVar38 = (bool)((byte)(uVar33 >> 8) & 1);
                          auVar87._32_4_ =
                               (uint)bVar38 * auVar101._32_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x220);
                          bVar38 = (bool)((byte)(uVar33 >> 9) & 1);
                          auVar87._36_4_ =
                               (uint)bVar38 * auVar101._36_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x224);
                          bVar38 = (bool)((byte)(uVar33 >> 10) & 1);
                          auVar87._40_4_ =
                               (uint)bVar38 * auVar101._40_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x228);
                          bVar38 = (bool)((byte)(uVar33 >> 0xb) & 1);
                          auVar87._44_4_ =
                               (uint)bVar38 * auVar101._44_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x22c);
                          bVar38 = (bool)((byte)(uVar33 >> 0xc) & 1);
                          auVar87._48_4_ =
                               (uint)bVar38 * auVar101._48_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x230);
                          bVar38 = (bool)((byte)(uVar33 >> 0xd) & 1);
                          auVar87._52_4_ =
                               (uint)bVar38 * auVar101._52_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x234);
                          bVar38 = (bool)((byte)(uVar33 >> 0xe) & 1);
                          auVar87._56_4_ =
                               (uint)bVar38 * auVar101._56_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x238);
                          bVar38 = SUB81(uVar33 >> 0xf,0);
                          auVar87._60_4_ =
                               (uint)bVar38 * auVar101._60_4_ |
                               (uint)!bVar38 * *(int *)(local_5f0.ray + 0x23c);
                          *(undefined1 (*) [64])(local_5f0.ray + 0x200) = auVar87;
                          bVar29 = 1;
                          if ((short)uVar33 != 0) goto LAB_01cd4221;
                        }
                        auVar247 = ZEXT464(0x3f800000);
                        *(float *)(ray + k * 4 + 0x200) = fVar211;
                        bVar29 = 0;
                      }
LAB_01cd4221:
                      bVar35 = (bool)(bVar35 | bVar29);
                    }
                  }
                }
              }
            }
          }
          break;
        }
        lVar28 = lVar28 + -1;
      } while (lVar28 != 0);
      goto LAB_01cd3363;
    }
    auVar42 = vinsertps_avx(auVar139,auVar53,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }